

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testBoxAlgo.cpp
# Opt level: O2

void testBoxAlgo(void)

{
  float *pfVar1;
  Vec3<float> *v;
  float fVar2;
  float fVar3;
  float fVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined8 uVar15;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  uint __line;
  bool bVar35;
  int j;
  ostream *poVar36;
  long lVar37;
  long lVar38;
  long lVar39;
  Vec3<float> *pVVar40;
  Box<Imath_3_2::Vec3<float>_> *pBVar41;
  char *__assertion;
  int iVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  Line3f ray;
  Box3f b2;
  V3f r;
  V3f local_32c;
  V3f r_1;
  V3f local_314;
  V3f s;
  float fStack_2fc;
  V3f ip2;
  float fStack_29c;
  Rand48 random;
  V3f local_244;
  Box<Imath_3_2::Vec3<float>_> local_238;
  Box<Imath_3_2::Vec3<float>_> local_218;
  long local_200;
  M44f M;
  Box<Imath_3_2::Vec3<float>_> local_88;
  Box<Imath_3_2::Vec3<float>_> local_68;
  Box3f b6;
  
  poVar36 = std::operator<<((ostream *)&std::cout,"Testing box algorithms");
  std::endl<char,std::char_traits<char>>(poVar36);
  poVar36 = std::operator<<((ostream *)&std::cout,"  ray-box entry and exit, random rays");
  std::endl<char,std::char_traits<char>>(poVar36);
  M.x[0][0] = -1.0;
  M.x[0][1] = -1.0;
  M.x[0][2] = -1.0;
  M.x[0][3] = 1.0;
  M.x[1][0] = 1.0;
  M.x[1][1] = 1.0;
  M.x[1][2] = 10.0;
  M.x[1][3] = 20.0;
  M.x[2][0] = 30.0;
  M.x[2][1] = 1010.0;
  M.x[2][2] = 21.0;
  M.x[2][3] = 31.0;
  M.x[3][0] = 10.0;
  M.x[3][1] = 20.0;
  M.x[3][2] = 30.0;
  M.x[3][3] = 11.0;
  lVar38 = 0;
  do {
    if (lVar38 == 0xf) {
      poVar36 = std::operator<<((ostream *)&std::cout,
                                "  ray-box entry and exit, nearly axis-parallel rays");
      std::endl<char,std::char_traits<char>>(poVar36);
      M.x[0][0] = -1e+15;
      M.x[0][1] = -1e+15;
      M.x[0][2] = -1e+15;
      M.x[0][3] = 1e+15;
      r_1.x = -2e+15;
      r_1.y = 0.0;
      r_1.z = 0.0;
      M.x[1][0] = 1e+15;
      M.x[1][1] = 1e+15;
      r.x = 2e+15;
      r.y = 0.0;
      r.z = 0.0;
      Imath_3_2::Line3<float>::set((Line3<float> *)&b2,&r_1,&r);
      ray.pos.x = b2.min.x;
      ray.pos.y = b2.min.y;
      ray.pos.z = b2.min.z;
      ray.dir.y = b2.max.y;
      ray.dir.z = b2.max.z;
      pVVar40 = &r;
      bVar35 = Imath_3_2::findEntryAndExitPoints<float>
                         (&ray,(Box<Imath_3_2::Vec3<float>_> *)&M,&r_1,pVVar40);
      auVar29._4_4_ = -(uint)(r_1.y != 0.0);
      auVar29._0_4_ = -(uint)(r_1.x != -1e+15);
      auVar29._8_4_ = -(uint)(r_1.z != 0.0);
      auVar29._12_4_ = -(uint)(r.x != 1e+15);
      iVar42 = movmskps((int)pVVar40,auVar29);
      if (iVar42 == 0) {
        if ((((r.y == 0.0) && (!NAN(r.y))) && (bVar35)) && ((r.z == 0.0 && (!NAN(r.z))))) {
          anon_unknown.dwarf_463b6::testPerturbedRayBoxEntryExit((Box3f *)&M,&ray,true);
          s.x = 2e+15;
          s.y = 0.0;
          s.z = 0.0;
          ip2.x = -2e+15;
          ip2.y = 0.0;
          stack0xfffffffffffffd60 = stack0xfffffffffffffd60 & 0xffffffff00000000;
          Imath_3_2::Line3<float>::set((Line3<float> *)&b2,&s,&ip2);
          ray.pos.x = b2.min.x;
          ray.pos.y = b2.min.y;
          ray.pos.z = b2.min.z;
          ray.dir.y = b2.max.y;
          ray.dir.z = b2.max.z;
          pVVar40 = &r;
          bVar35 = Imath_3_2::findEntryAndExitPoints<float>(&ray,(Box3f *)&M,&r_1,pVVar40);
          auVar30._4_4_ = -(uint)(r_1.y != 0.0);
          auVar30._0_4_ = -(uint)(r_1.x != 1e+15);
          auVar30._8_4_ = -(uint)(r_1.z != 0.0);
          auVar30._12_4_ = -(uint)(r.x != -1e+15);
          iVar42 = movmskps((int)pVVar40,auVar30);
          if (iVar42 == 0) {
            if (((r.y == 0.0) && (!NAN(r.y))) && ((bVar35 && ((r.z == 0.0 && (!NAN(r.z))))))) {
              anon_unknown.dwarf_463b6::testPerturbedRayBoxEntryExit((Box3f *)&M,&ray,true);
              s.x = -2e+15;
              s.y = 2e+15;
              s.z = 0.0;
              ip2.x = 2e+15;
              ip2.y = 2e+15;
              stack0xfffffffffffffd60 = stack0xfffffffffffffd60 & 0xffffffff00000000;
              Imath_3_2::Line3<float>::set((Line3<float> *)&b2,&s,&ip2);
              ray.pos.x = b2.min.x;
              ray.pos.y = b2.min.y;
              ray.pos.z = b2.min.z;
              ray.dir.y = b2.max.y;
              ray.dir.z = b2.max.z;
              bVar35 = Imath_3_2::findEntryAndExitPoints<float>(&ray,(Box3f *)&M,&r_1,&r);
              if (bVar35) {
                __assert_fail("!b",
                              "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBoxAlgo.cpp"
                              ,0x16b,"void (anonymous namespace)::entryAndExitPoints2()");
              }
              anon_unknown.dwarf_463b6::testPerturbedRayBoxEntryExit((Box3f *)&M,&ray,false);
              s.x = 2e+15;
              s.y = 2e+15;
              s.z = 0.0;
              ip2.x = -2e+15;
              ip2.y = 2e+15;
              stack0xfffffffffffffd60 = stack0xfffffffffffffd60 & 0xffffffff00000000;
              Imath_3_2::Line3<float>::set((Line3<float> *)&b2,&s,&ip2);
              ray.pos.x = b2.min.x;
              ray.pos.y = b2.min.y;
              ray.pos.z = b2.min.z;
              ray.dir.y = b2.max.y;
              ray.dir.z = b2.max.z;
              bVar35 = Imath_3_2::findEntryAndExitPoints<float>(&ray,(Box3f *)&M,&r_1,&r);
              if (bVar35) {
                __assert_fail("!b",
                              "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBoxAlgo.cpp"
                              ,0x170,"void (anonymous namespace)::entryAndExitPoints2()");
              }
              anon_unknown.dwarf_463b6::testPerturbedRayBoxEntryExit((Box3f *)&M,&ray,false);
              s.x = 0.0;
              s.y = -2e+15;
              s.z = 0.0;
              ip2.x = 0.0;
              ip2.y = 2e+15;
              stack0xfffffffffffffd60 = stack0xfffffffffffffd60 & 0xffffffff00000000;
              Imath_3_2::Line3<float>::set((Line3<float> *)&b2,&s,&ip2);
              ray.pos.x = b2.min.x;
              ray.pos.y = b2.min.y;
              ray.pos.z = b2.min.z;
              ray.dir.y = b2.max.y;
              ray.dir.z = b2.max.z;
              pVVar40 = &r;
              bVar35 = Imath_3_2::findEntryAndExitPoints<float>(&ray,(Box3f *)&M,&r_1,pVVar40);
              auVar31._4_4_ = -(uint)(r_1.y != -1e+15);
              auVar31._0_4_ = -(uint)(r_1.x != 0.0);
              auVar31._8_4_ = -(uint)(r_1.z != 0.0);
              auVar31._12_4_ = -(uint)(r.x != 0.0);
              iVar42 = movmskps((int)pVVar40,auVar31);
              if (iVar42 == 0) {
                if ((((r.y == 1e+15) && (!NAN(r.y))) && (bVar35)) && ((r.z == 0.0 && (!NAN(r.z)))))
                {
                  anon_unknown.dwarf_463b6::testPerturbedRayBoxEntryExit((Box3f *)&M,&ray,true);
                  s.x = 0.0;
                  s.y = 2e+15;
                  s.z = 0.0;
                  ip2.x = 0.0;
                  ip2.y = -2e+15;
                  stack0xfffffffffffffd60 = stack0xfffffffffffffd60 & 0xffffffff00000000;
                  Imath_3_2::Line3<float>::set((Line3<float> *)&b2,&s,&ip2);
                  ray.pos.x = b2.min.x;
                  ray.pos.y = b2.min.y;
                  ray.pos.z = b2.min.z;
                  ray.dir.y = b2.max.y;
                  ray.dir.z = b2.max.z;
                  pVVar40 = &r;
                  bVar35 = Imath_3_2::findEntryAndExitPoints<float>(&ray,(Box3f *)&M,&r_1,pVVar40);
                  auVar32._4_4_ = -(uint)(r_1.y != 1e+15);
                  auVar32._0_4_ = -(uint)(r_1.x != 0.0);
                  auVar32._8_4_ = -(uint)(r_1.z != 0.0);
                  auVar32._12_4_ = -(uint)(r.x != 0.0);
                  iVar42 = movmskps((int)pVVar40,auVar32);
                  if (iVar42 == 0) {
                    if (((r.y == -1e+15) && (!NAN(r.y))) &&
                       ((bVar35 && ((r.z == 0.0 && (!NAN(r.z))))))) {
                      anon_unknown.dwarf_463b6::testPerturbedRayBoxEntryExit((Box3f *)&M,&ray,true);
                      s.x = 0.0;
                      s.y = -2e+15;
                      s.z = 2e+15;
                      ip2.x = 0.0;
                      ip2.y = 2e+15;
                      ip2.z = 2e+15;
                      Imath_3_2::Line3<float>::set((Line3<float> *)&b2,&s,&ip2);
                      ray.pos.x = b2.min.x;
                      ray.pos.y = b2.min.y;
                      ray.pos.z = b2.min.z;
                      ray.dir.y = b2.max.y;
                      ray.dir.z = b2.max.z;
                      bVar35 = Imath_3_2::findEntryAndExitPoints<float>(&ray,(Box3f *)&M,&r_1,&r);
                      if (bVar35) {
                        __assert_fail("!b",
                                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBoxAlgo.cpp"
                                      ,0x17f,"void (anonymous namespace)::entryAndExitPoints2()");
                      }
                      anon_unknown.dwarf_463b6::testPerturbedRayBoxEntryExit((Box3f *)&M,&ray,false)
                      ;
                      s.x = 0.0;
                      s.y = 2e+15;
                      s.z = 2e+15;
                      ip2.x = 0.0;
                      ip2.y = -2e+15;
                      ip2.z = 2e+15;
                      Imath_3_2::Line3<float>::set((Line3<float> *)&b2,&s,&ip2);
                      ray.pos.x = b2.min.x;
                      ray.pos.y = b2.min.y;
                      ray.pos.z = b2.min.z;
                      ray.dir.y = b2.max.y;
                      ray.dir.z = b2.max.z;
                      bVar35 = Imath_3_2::findEntryAndExitPoints<float>(&ray,(Box3f *)&M,&r_1,&r);
                      if (bVar35) {
                        __assert_fail("!b",
                                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBoxAlgo.cpp"
                                      ,0x184,"void (anonymous namespace)::entryAndExitPoints2()");
                      }
                      anon_unknown.dwarf_463b6::testPerturbedRayBoxEntryExit((Box3f *)&M,&ray,false)
                      ;
                      s.x = 0.0;
                      s.y = 0.0;
                      s.z = -2e+15;
                      ip2.x = 0.0;
                      ip2.y = 0.0;
                      ip2.z = 2e+15;
                      Imath_3_2::Line3<float>::set((Line3<float> *)&b2,&s,&ip2);
                      ray.pos.x = b2.min.x;
                      ray.pos.y = b2.min.y;
                      ray.pos.z = b2.min.z;
                      ray.dir.y = b2.max.y;
                      ray.dir.z = b2.max.z;
                      pVVar40 = &r;
                      bVar35 = Imath_3_2::findEntryAndExitPoints<float>
                                         (&ray,(Box3f *)&M,&r_1,pVVar40);
                      auVar33._4_4_ = -(uint)(r_1.y != 0.0);
                      auVar33._0_4_ = -(uint)(r_1.x != 0.0);
                      auVar33._8_4_ = -(uint)(r_1.z != -1e+15);
                      auVar33._12_4_ = -(uint)(r.x != 0.0);
                      iVar42 = movmskps((int)pVVar40,auVar33);
                      if (iVar42 == 0) {
                        if ((((r.y == 0.0) && (!NAN(r.y))) && (bVar35)) &&
                           ((r.z == 1e+15 && (!NAN(r.z))))) {
                          anon_unknown.dwarf_463b6::testPerturbedRayBoxEntryExit
                                    ((Box3f *)&M,&ray,true);
                          s.x = 0.0;
                          s.y = 0.0;
                          s.z = 2e+15;
                          ip2.x = 0.0;
                          ip2.y = 0.0;
                          ip2.z = -2e+15;
                          Imath_3_2::Line3<float>::set((Line3<float> *)&b2,&s,&ip2);
                          ray.pos.x = b2.min.x;
                          ray.pos.y = b2.min.y;
                          ray.pos.z = b2.min.z;
                          ray.dir.y = b2.max.y;
                          ray.dir.z = b2.max.z;
                          pVVar40 = &r;
                          bVar35 = Imath_3_2::findEntryAndExitPoints<float>
                                             (&ray,(Box3f *)&M,&r_1,pVVar40);
                          auVar34._4_4_ = -(uint)(r_1.y != 0.0);
                          auVar34._0_4_ = -(uint)(r_1.x != 0.0);
                          auVar34._8_4_ = -(uint)(r_1.z != 1e+15);
                          auVar34._12_4_ = -(uint)(r.x != 0.0);
                          iVar42 = movmskps((int)pVVar40,auVar34);
                          if (iVar42 == 0) {
                            if (((r.y == 0.0) && (!NAN(r.y))) &&
                               ((bVar35 && ((r.z == -1e+15 && (!NAN(r.z))))))) {
                              anon_unknown.dwarf_463b6::testPerturbedRayBoxEntryExit
                                        ((Box3f *)&M,&ray,true);
                              s.x = 2e+15;
                              s.y = 0.0;
                              s.z = -2e+15;
                              ip2.x = 2e+15;
                              ip2.y = 0.0;
                              ip2.z = 2e+15;
                              Imath_3_2::Line3<float>::set((Line3<float> *)&b2,&s,&ip2);
                              ray.pos.x = b2.min.x;
                              ray.pos.y = b2.min.y;
                              ray.pos.z = b2.min.z;
                              ray.dir.y = b2.max.y;
                              ray.dir.z = b2.max.z;
                              bVar35 = Imath_3_2::findEntryAndExitPoints<float>
                                                 (&ray,(Box3f *)&M,&r_1,&r);
                              if (bVar35) {
                                __assert_fail("!b",
                                              "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBoxAlgo.cpp"
                                              ,0x193,
                                              "void (anonymous namespace)::entryAndExitPoints2()");
                              }
                              anon_unknown.dwarf_463b6::testPerturbedRayBoxEntryExit
                                        ((Box3f *)&M,&ray,false);
                              s.x = 2e+15;
                              s.y = 0.0;
                              stack0xfffffffffffffd00 = CONCAT44(fStack_2fc,0x58e35fa9);
                              ip2.x = 2e+15;
                              ip2.y = 0.0;
                              ip2.z = -2e+15;
                              Imath_3_2::Line3<float>::set((Line3<float> *)&b2,&s,&ip2);
                              ray.pos.x = b2.min.x;
                              ray.pos.y = b2.min.y;
                              ray.pos.z = b2.min.z;
                              ray.dir.x = b2.max.x;
                              ray.dir.y = b2.max.y;
                              ray.dir.z = b2.max.z;
                              pVVar40 = &r;
                              bVar35 = Imath_3_2::findEntryAndExitPoints<float>
                                                 (&ray,(Box3f *)&M,&r_1,pVVar40);
                              if (bVar35) {
                                __assert_fail("!b",
                                              "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBoxAlgo.cpp"
                                              ,0x198,
                                              "void (anonymous namespace)::entryAndExitPoints2()");
                              }
                              lVar38 = 0;
                              anon_unknown.dwarf_463b6::testPerturbedRayBoxEntryExit
                                        ((Box3f *)&M,&ray,false);
                              poVar36 = std::operator<<((ostream *)&std::cout,
                                                        "  ray-box intersection, random rays");
                              std::endl<char,std::char_traits<char>>(poVar36);
                              M.x[0][0] = -1.0;
                              M.x[0][1] = -1.0;
                              M.x[0][2] = -1.0;
                              M.x[0][3] = 1.0;
                              M.x[1][0] = 1.0;
                              M.x[1][1] = 1.0;
                              M.x[1][2] = 10.0;
                              M.x[1][3] = 20.0;
                              M.x[2][0] = 30.0;
                              M.x[2][1] = 1010.0;
                              M.x[2][2] = 21.0;
                              M.x[2][3] = 31.0;
                              M.x[3][0] = 10.0;
                              M.x[3][1] = 20.0;
                              M.x[3][2] = 30.0;
                              M.x[3][3] = 11.0;
                              do {
                                if (lVar38 == 0xf) {
                                  poVar36 = std::operator<<((ostream *)&std::cout,
                                                                                                                        
                                                  "  ray-box intersection, nearly axis-parallel rays"
                                                  );
                                  std::endl<char,std::char_traits<char>>(poVar36);
                                  M.x[0][0] = -1e+15;
                                  M.x[0][1] = -1e+15;
                                  M.x[0][2] = -1e+15;
                                  M.x[0][3] = 1e+15;
                                  M.x[1][0] = 1e+15;
                                  M.x[1][1] = 1e+15;
                                  r_1.x = -2e+15;
                                  r_1.y = 0.0;
                                  r_1.z = 0.0;
                                  r.x = 2e+15;
                                  r.y = 0.0;
                                  r.z = 0.0;
                                  Imath_3_2::Line3<float>::set((Line3<float> *)&b2,&r_1,&r);
                                  ray.pos.x = b2.min.x;
                                  ray.pos.y = b2.min.y;
                                  ray.pos.z = b2.min.z;
                                  ray.dir.y = b2.max.y;
                                  ray.dir.z = b2.max.z;
                                  bVar35 = Imath_3_2::intersects<float>
                                                     ((Box<Imath_3_2::Vec3<float>_> *)&M,&ray,&r_1);
                                  if ((((!bVar35) || (r_1.x != -1e+15)) || (NAN(r_1.x))) ||
                                     (((r_1.y != 0.0 || (NAN(r_1.y))) ||
                                      ((r_1.z != 0.0 || (NAN(r_1.z))))))) {
                                    __assert_fail("b && ip == V3f (-1e15f, 0, 0)",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBoxAlgo.cpp"
                                                  ,0x2d5,
                                                  "void (anonymous namespace)::rayBoxIntersection2()"
                                                 );
                                  }
                                  anon_unknown.dwarf_463b6::testPerturbedRayBox
                                            ((Box3f *)&M,&ray,true);
                                  r.x = 2e+15;
                                  r.y = 0.0;
                                  r.z = 0.0;
                                  s.x = -2e+15;
                                  s.y = 0.0;
                                  stack0xfffffffffffffd00 =
                                       stack0xfffffffffffffd00 & 0xffffffff00000000;
                                  Imath_3_2::Line3<float>::set((Line3<float> *)&b2,&r,&s);
                                  ray.pos.x = b2.min.x;
                                  ray.pos.y = b2.min.y;
                                  ray.pos.z = b2.min.z;
                                  ray.dir.y = b2.max.y;
                                  ray.dir.z = b2.max.z;
                                  bVar35 = Imath_3_2::intersects<float>((Box3f *)&M,&ray,&r_1);
                                  if (((!bVar35) || (r_1.x != 1e+15)) ||
                                     (((NAN(r_1.x) ||
                                       (((r_1.y != 0.0 || (NAN(r_1.y))) || (r_1.z != 0.0)))) ||
                                      (NAN(r_1.z))))) {
                                    __assert_fail("b && ip == V3f (1e15f, 0, 0)",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBoxAlgo.cpp"
                                                  ,0x2da,
                                                  "void (anonymous namespace)::rayBoxIntersection2()"
                                                 );
                                  }
                                  anon_unknown.dwarf_463b6::testPerturbedRayBox
                                            ((Box3f *)&M,&ray,true);
                                  r.x = -2e+15;
                                  r.y = 2e+15;
                                  r.z = 0.0;
                                  s.x = 2e+15;
                                  s.y = 2e+15;
                                  stack0xfffffffffffffd00 =
                                       stack0xfffffffffffffd00 & 0xffffffff00000000;
                                  Imath_3_2::Line3<float>::set((Line3<float> *)&b2,&r,&s);
                                  ray.pos.x = b2.min.x;
                                  ray.pos.y = b2.min.y;
                                  ray.pos.z = b2.min.z;
                                  ray.dir.y = b2.max.y;
                                  ray.dir.z = b2.max.z;
                                  bVar35 = Imath_3_2::intersects<float>((Box3f *)&M,&ray,&r_1);
                                  if (bVar35) {
                                    __assert_fail("!b",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBoxAlgo.cpp"
                                                  ,0x2df,
                                                  "void (anonymous namespace)::rayBoxIntersection2()"
                                                 );
                                  }
                                  anon_unknown.dwarf_463b6::testPerturbedRayBox
                                            ((Box3f *)&M,&ray,false);
                                  r.x = 2e+15;
                                  r.y = 2e+15;
                                  r.z = 0.0;
                                  s.x = -2e+15;
                                  s.y = 2e+15;
                                  stack0xfffffffffffffd00 =
                                       stack0xfffffffffffffd00 & 0xffffffff00000000;
                                  Imath_3_2::Line3<float>::set((Line3<float> *)&b2,&r,&s);
                                  ray.pos.x = b2.min.x;
                                  ray.pos.y = b2.min.y;
                                  ray.pos.z = b2.min.z;
                                  ray.dir.y = b2.max.y;
                                  ray.dir.z = b2.max.z;
                                  bVar35 = Imath_3_2::intersects<float>((Box3f *)&M,&ray,&r_1);
                                  if (bVar35) {
                                    __assert_fail("!b",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBoxAlgo.cpp"
                                                  ,0x2e4,
                                                  "void (anonymous namespace)::rayBoxIntersection2()"
                                                 );
                                  }
                                  anon_unknown.dwarf_463b6::testPerturbedRayBox
                                            ((Box3f *)&M,&ray,false);
                                  r.x = 0.0;
                                  r.y = -2e+15;
                                  r.z = 0.0;
                                  s.x = 0.0;
                                  s.y = 2e+15;
                                  stack0xfffffffffffffd00 =
                                       stack0xfffffffffffffd00 & 0xffffffff00000000;
                                  Imath_3_2::Line3<float>::set((Line3<float> *)&b2,&r,&s);
                                  ray.pos.x = b2.min.x;
                                  ray.pos.y = b2.min.y;
                                  ray.pos.z = b2.min.z;
                                  ray.dir.y = b2.max.y;
                                  ray.dir.z = b2.max.z;
                                  bVar35 = Imath_3_2::intersects<float>((Box3f *)&M,&ray,&r_1);
                                  if (((((!bVar35) || (r_1.x != 0.0)) ||
                                       ((NAN(r_1.x) || ((r_1.y != -1e+15 || (NAN(r_1.y))))))) ||
                                      (r_1.z != 0.0)) || (NAN(r_1.z))) {
                                    __assert_fail("b && ip == V3f (0, -1e15f, 0)",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBoxAlgo.cpp"
                                                  ,0x2e9,
                                                  "void (anonymous namespace)::rayBoxIntersection2()"
                                                 );
                                  }
                                  anon_unknown.dwarf_463b6::testPerturbedRayBox
                                            ((Box3f *)&M,&ray,true);
                                  r.x = 0.0;
                                  r.y = 2e+15;
                                  r.z = 0.0;
                                  s.x = 0.0;
                                  s.y = -2e+15;
                                  stack0xfffffffffffffd00 =
                                       stack0xfffffffffffffd00 & 0xffffffff00000000;
                                  Imath_3_2::Line3<float>::set((Line3<float> *)&b2,&r,&s);
                                  ray.pos.x = b2.min.x;
                                  ray.pos.y = b2.min.y;
                                  ray.pos.z = b2.min.z;
                                  ray.dir.y = b2.max.y;
                                  ray.dir.z = b2.max.z;
                                  bVar35 = Imath_3_2::intersects<float>((Box3f *)&M,&ray,&r_1);
                                  if (((((!bVar35) || (r_1.x != 0.0)) || (NAN(r_1.x))) ||
                                      ((r_1.y != 1e+15 || (NAN(r_1.y))))) ||
                                     ((r_1.z != 0.0 || (NAN(r_1.z))))) {
                                    __assert_fail("b && ip == V3f (0, 1e15f, 0)",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBoxAlgo.cpp"
                                                  ,0x2ee,
                                                  "void (anonymous namespace)::rayBoxIntersection2()"
                                                 );
                                  }
                                  anon_unknown.dwarf_463b6::testPerturbedRayBox
                                            ((Box3f *)&M,&ray,true);
                                  r.x = 0.0;
                                  r.y = -2e+15;
                                  r.z = 2e+15;
                                  s.x = 0.0;
                                  s.y = 2e+15;
                                  s.z = 2e+15;
                                  Imath_3_2::Line3<float>::set((Line3<float> *)&b2,&r,&s);
                                  ray.pos.x = b2.min.x;
                                  ray.pos.y = b2.min.y;
                                  ray.pos.z = b2.min.z;
                                  ray.dir.y = b2.max.y;
                                  ray.dir.z = b2.max.z;
                                  bVar35 = Imath_3_2::intersects<float>((Box3f *)&M,&ray,&r_1);
                                  if (bVar35) {
                                    __assert_fail("!b",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBoxAlgo.cpp"
                                                  ,0x2f3,
                                                  "void (anonymous namespace)::rayBoxIntersection2()"
                                                 );
                                  }
                                  anon_unknown.dwarf_463b6::testPerturbedRayBox
                                            ((Box3f *)&M,&ray,false);
                                  r.x = 0.0;
                                  r.y = 2e+15;
                                  r.z = 2e+15;
                                  s.x = 0.0;
                                  s.y = -2e+15;
                                  s.z = 2e+15;
                                  Imath_3_2::Line3<float>::set((Line3<float> *)&b2,&r,&s);
                                  ray.pos.x = b2.min.x;
                                  ray.pos.y = b2.min.y;
                                  ray.pos.z = b2.min.z;
                                  ray.dir.y = b2.max.y;
                                  ray.dir.z = b2.max.z;
                                  bVar35 = Imath_3_2::intersects<float>((Box3f *)&M,&ray,&r_1);
                                  if (bVar35) {
                                    __assert_fail("!b",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBoxAlgo.cpp"
                                                  ,0x2f8,
                                                  "void (anonymous namespace)::rayBoxIntersection2()"
                                                 );
                                  }
                                  anon_unknown.dwarf_463b6::testPerturbedRayBox
                                            ((Box3f *)&M,&ray,false);
                                  r.x = 0.0;
                                  r.y = 0.0;
                                  r.z = -2e+15;
                                  s.x = 0.0;
                                  s.y = 0.0;
                                  s.z = 2e+15;
                                  Imath_3_2::Line3<float>::set((Line3<float> *)&b2,&r,&s);
                                  ray.pos.x = b2.min.x;
                                  ray.pos.y = b2.min.y;
                                  ray.pos.z = b2.min.z;
                                  ray.dir.y = b2.max.y;
                                  ray.dir.z = b2.max.z;
                                  bVar35 = Imath_3_2::intersects<float>((Box3f *)&M,&ray,&r_1);
                                  if ((((!bVar35) || (r_1.x != 0.0)) ||
                                      ((NAN(r_1.x) ||
                                       (((r_1.y != 0.0 || (NAN(r_1.y))) || (r_1.z != -1e+15)))))) ||
                                     (NAN(r_1.z))) {
                                    __assert_fail("b && ip == V3f (0, 0, -1e15f)",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBoxAlgo.cpp"
                                                  ,0x2fd,
                                                  "void (anonymous namespace)::rayBoxIntersection2()"
                                                 );
                                  }
                                  anon_unknown.dwarf_463b6::testPerturbedRayBox
                                            ((Box3f *)&M,&ray,true);
                                  r.x = 0.0;
                                  r.y = 0.0;
                                  r.z = 2e+15;
                                  s.x = 0.0;
                                  s.y = 0.0;
                                  s.z = -2e+15;
                                  Imath_3_2::Line3<float>::set((Line3<float> *)&b2,&r,&s);
                                  ray.pos.x = b2.min.x;
                                  ray.pos.y = b2.min.y;
                                  ray.pos.z = b2.min.z;
                                  ray.dir.y = b2.max.y;
                                  ray.dir.z = b2.max.z;
                                  bVar35 = Imath_3_2::intersects<float>((Box3f *)&M,&ray,&r_1);
                                  if ((((!bVar35) || (r_1.x != 0.0)) ||
                                      ((NAN(r_1.x) || ((r_1.y != 0.0 || (NAN(r_1.y))))))) ||
                                     ((r_1.z != 1e+15 || (NAN(r_1.z))))) {
                                    __assert_fail("b && ip == V3f (0, 0, 1e15f)",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBoxAlgo.cpp"
                                                  ,0x302,
                                                  "void (anonymous namespace)::rayBoxIntersection2()"
                                                 );
                                  }
                                  anon_unknown.dwarf_463b6::testPerturbedRayBox
                                            ((Box3f *)&M,&ray,true);
                                  r.x = 2e+15;
                                  r.y = 0.0;
                                  r.z = -2e+15;
                                  s.x = 2e+15;
                                  s.y = 0.0;
                                  s.z = 2e+15;
                                  Imath_3_2::Line3<float>::set((Line3<float> *)&b2,&r,&s);
                                  ray.pos.x = b2.min.x;
                                  ray.pos.y = b2.min.y;
                                  ray.pos.z = b2.min.z;
                                  ray.dir.y = b2.max.y;
                                  ray.dir.z = b2.max.z;
                                  bVar35 = Imath_3_2::intersects<float>((Box3f *)&M,&ray,&r_1);
                                  if (bVar35) {
                                    __assert_fail("!b",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBoxAlgo.cpp"
                                                  ,0x307,
                                                  "void (anonymous namespace)::rayBoxIntersection2()"
                                                 );
                                  }
                                  anon_unknown.dwarf_463b6::testPerturbedRayBox
                                            ((Box3f *)&M,&ray,false);
                                  r.x = 2e+15;
                                  r.y = 0.0;
                                  r.z = 2e+15;
                                  s.x = 2e+15;
                                  s.y = 0.0;
                                  s.z = -2e+15;
                                  Imath_3_2::Line3<float>::set((Line3<float> *)&b2,&r,&s);
                                  ray.pos.x = b2.min.x;
                                  ray.pos.y = b2.min.y;
                                  ray.pos.z = b2.min.z;
                                  ray.dir.y = b2.max.y;
                                  ray.dir.z = b2.max.z;
                                  bVar35 = Imath_3_2::intersects<float>((Box3f *)&M,&ray,&r_1);
                                  if (bVar35) {
                                    __assert_fail("!b",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBoxAlgo.cpp"
                                                  ,0x30c,
                                                  "void (anonymous namespace)::rayBoxIntersection2()"
                                                 );
                                  }
                                  anon_unknown.dwarf_463b6::testPerturbedRayBox
                                            ((Box3f *)&M,&ray,false);
                                  poVar36 = std::operator<<((ostream *)&std::cout,
                                                            "  transform box by matrix");
                                  std::endl<char,std::char_traits<char>>(poVar36);
                                  ray.pos.x = 4.0;
                                  ray.pos.y = 5.0;
                                  ray.pos.z = 6.0;
                                  ray.dir.x = 7.0;
                                  ray.dir.y = 8.0;
                                  ray.dir.z = 9.0;
                                  M.x[0][0] = 1.0;
                                  M.x[0][1] = 0.0;
                                  M.x[0][2] = 0.0;
                                  M.x[0][3] = 0.0;
                                  M.x[1][0] = 0.0;
                                  M.x[1][1] = 1.0;
                                  M.x[1][2] = 0.0;
                                  M.x[1][3] = 0.0;
                                  M.x[2][0] = 0.0;
                                  M.x[2][1] = 0.0;
                                  M.x[2][2] = 1.0;
                                  M.x[2][3] = 0.0;
                                  M.x[3][0] = 0.0;
                                  M.x[3][1] = 0.0;
                                  M.x[3][2] = 0.0;
                                  M.x[3][3] = 1.0;
                                  b2.min.x = 1.0;
                                  b2.min.y = 2.0;
                                  b2.min.z = 3.0;
                                  Imath_3_2::Matrix44<float>::setEulerAngles<float>
                                            ((Matrix44<float> *)&M,&b2.min);
                                  b2.min.x = 20.0;
                                  b2.min.y = -15.0;
                                  b2.min.z = 2.0;
                                  Imath_3_2::Matrix44<float>::translate<float>
                                            ((Matrix44<float> *)&M,&b2.min);
                                  Imath_3_2::transform<float,float>
                                            (&b2,(Imath_3_2 *)&ray,
                                             (Box<Imath_3_2::Vec3<float>_> *)&M,
                                             (Matrix44<float> *)pVVar40);
                                  Imath_3_2::affineTransform<float,float>
                                            ((Box<Imath_3_2::Vec3<float>_> *)&r_1,(Imath_3_2 *)&ray,
                                             (Box<Imath_3_2::Vec3<float>_> *)&M,
                                             (Matrix44<float> *)pVVar40);
                                  anon_unknown.dwarf_463b6::transformSimple
                                            ((Box3f *)&r,(Box3f *)&ray,&M);
                                  s.x = 3.4028235e+38;
                                  s.y = 3.4028235e+38;
                                  s.z = 3.4028235e+38;
                                  fStack_2fc = -3.4028235e+38;
                                  ip2.x = 3.4028235e+38;
                                  ip2.y = 3.4028235e+38;
                                  ip2.z = 3.4028235e+38;
                                  fStack_29c = -3.4028235e+38;
                                  Imath_3_2::transform<float,float>
                                            ((Box<Imath_3_2::Vec3<float>_> *)&ray,
                                             (Matrix44<float> *)&M,
                                             (Box<Imath_3_2::Vec3<float>_> *)&s);
                                  Imath_3_2::affineTransform<float,float>
                                            ((Box<Imath_3_2::Vec3<float>_> *)&ray,
                                             (Matrix44<float> *)&M,
                                             (Box<Imath_3_2::Vec3<float>_> *)&ip2);
                                  bVar35 = anon_unknown.dwarf_463b6::approximatelyEqual
                                                     (&b2.min,&r,5.9604645e-07);
                                  if (!bVar35) {
                                    __assert_fail("approximatelyEqual (b2.min, b4.min, e)",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBoxAlgo.cpp"
                                                  ,0x338,
                                                  "void (anonymous namespace)::boxMatrixTransform()"
                                                 );
                                  }
                                  bVar35 = anon_unknown.dwarf_463b6::approximatelyEqual
                                                     (&b2.max,&local_32c,5.9604645e-07);
                                  if (!bVar35) {
                                    __assert_fail("approximatelyEqual (b2.max, b4.max, e)",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBoxAlgo.cpp"
                                                  ,0x339,
                                                  "void (anonymous namespace)::boxMatrixTransform()"
                                                 );
                                  }
                                  bVar35 = anon_unknown.dwarf_463b6::approximatelyEqual
                                                     (&local_314,&local_32c,5.9604645e-07);
                                  if (!bVar35) {
                                    __assert_fail("approximatelyEqual (b3.max, b4.max, e)",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBoxAlgo.cpp"
                                                  ,0x33a,
                                                  "void (anonymous namespace)::boxMatrixTransform()"
                                                 );
                                  }
                                  bVar35 = Imath_3_2::Box<Imath_3_2::Vec3<float>_>::operator==
                                                     ((Box<Imath_3_2::Vec3<float>_> *)&s,&b2);
                                  if (!bVar35) {
                                    __assert_fail("b21 == b2",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBoxAlgo.cpp"
                                                  ,0x33d,
                                                  "void (anonymous namespace)::boxMatrixTransform()"
                                                 );
                                  }
                                  bVar35 = Imath_3_2::Box<Imath_3_2::Vec3<float>_>::operator==
                                                     ((Box<Imath_3_2::Vec3<float>_> *)&ip2,
                                                      (Box<Imath_3_2::Vec3<float>_> *)&r_1);
                                  if (!bVar35) {
                                    __assert_fail("b31 == b3",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBoxAlgo.cpp"
                                                  ,0x33e,
                                                  "void (anonymous namespace)::boxMatrixTransform()"
                                                 );
                                  }
                                  M.x[0][3] = 1.0;
                                  M.x[1][3] = 2.0;
                                  M.x[2][3] = 3.0;
                                  M.x[3][3] = 4.0;
                                  Imath_3_2::transform<float,float>
                                            ((Box<Imath_3_2::Vec3<float>_> *)&random,
                                             (Imath_3_2 *)&ray,(Box<Imath_3_2::Vec3<float>_> *)&M,
                                             (Matrix44<float> *)pVVar40);
                                  anon_unknown.dwarf_463b6::transformSimple(&b6,(Box3f *)&ray,&M);
                                  local_68.min.x = 3.4028235e+38;
                                  local_68.min.y = 3.4028235e+38;
                                  local_68.min.z = 3.4028235e+38;
                                  local_68.max.x = -3.4028235e+38;
                                  local_68.max.y = -3.4028235e+38;
                                  local_68.max.z = -3.4028235e+38;
                                  Imath_3_2::transform<float,float>
                                            ((Box<Imath_3_2::Vec3<float>_> *)&ray,
                                             (Matrix44<float> *)&M,&local_68);
                                  bVar35 = anon_unknown.dwarf_463b6::approximatelyEqual
                                                     ((V3f *)&random,&b6.min,5.9604645e-07);
                                  if (!bVar35) {
                                    __assert_fail("approximatelyEqual (b5.min, b6.min, e)",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBoxAlgo.cpp"
                                                  ,0x34b,
                                                  "void (anonymous namespace)::boxMatrixTransform()"
                                                 );
                                  }
                                  bVar35 = anon_unknown.dwarf_463b6::approximatelyEqual
                                                     (&local_244,&b6.max,5.9604645e-07);
                                  if (!bVar35) {
                                    __assert_fail("approximatelyEqual (b5.max, b6.max, e)",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBoxAlgo.cpp"
                                                  ,0x34c,
                                                  "void (anonymous namespace)::boxMatrixTransform()"
                                                 );
                                  }
                                  bVar35 = Imath_3_2::Box<Imath_3_2::Vec3<float>_>::operator==
                                                     (&local_68,
                                                      (Box<Imath_3_2::Vec3<float>_> *)&random);
                                  if (bVar35) {
                                    local_218.min.x = 3.4028235e+38;
                                    local_218.min.y = 3.4028235e+38;
                                    local_218.min.z = 3.4028235e+38;
                                    local_218.max.x = -3.4028235e+38;
                                    local_218.max.y = -3.4028235e+38;
                                    local_218.max.z = -3.4028235e+38;
                                    local_88.min.x = 3.4028235e+38;
                                    local_88.min.y = 3.4028235e+38;
                                    local_88.min.z = 3.4028235e+38;
                                    local_88.max.x = -3.4028235e+38;
                                    local_88.max.y = -3.4028235e+38;
                                    local_88.max.z = -3.4028235e+38;
                                    bVar35 = Imath_3_2::Box<Imath_3_2::Vec3<float>_>::isInfinite
                                                       (&local_88);
                                    if (bVar35) {
                                      __assert_fail("b7.isEmpty() && !b7.isInfinite()",
                                                                                                        
                                                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBoxAlgo.cpp"
                                                  ,0x352,
                                                  "void (anonymous namespace)::boxMatrixTransform()"
                                                  );
                                    }
                                    Imath_3_2::affineTransform<float,float>(&local_88,&M,&local_218)
                                    ;
                                    if (local_218.min.x <= local_218.max.x) {
                                      if (local_218.min.y <= local_218.max.y) {
                                        if (local_218.min.z <= local_218.max.z) {
                                          __assert_fail("r.isEmpty()",
                                                                                                                
                                                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBoxAlgo.cpp"
                                                  ,0x354,
                                                  "void (anonymous namespace)::boxMatrixTransform()"
                                                  );
                                        }
                                      }
                                    }
                                    local_238.min.x = -3.4028235e+38;
                                    local_238.min.y = -3.4028235e+38;
                                    local_238.min.z = -3.4028235e+38;
                                    local_238.max.x = 3.4028235e+38;
                                    local_238.max.y = 3.4028235e+38;
                                    local_238.max.z = 3.4028235e+38;
                                    bVar35 = Imath_3_2::Box<Imath_3_2::Vec3<float>_>::isInfinite
                                                       (&local_238);
                                    if (bVar35) {
                                      if (local_238.min.x <= local_238.max.x) {
                                        if (local_238.min.y <= local_238.max.y) {
                                          if (local_238.min.z <= local_238.max.z) {
                                            Imath_3_2::affineTransform<float,float>
                                                      (&local_238,&M,&local_218);
                                            bVar35 = Imath_3_2::Box<Imath_3_2::Vec3<float>_>::
                                                     isInfinite(&local_218);
                                            if (!bVar35) {
                                              __assert_fail("r.isInfinite()",
                                                                                                                        
                                                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBoxAlgo.cpp"
                                                  ,0x35a,
                                                  "void (anonymous namespace)::boxMatrixTransform()"
                                                  );
                                            }
                                            poVar36 = std::operator<<((ostream *)&std::cout,
                                                                                                                                            
                                                  "  closest points in and on box");
                                            std::endl<char,std::char_traits<char>>(poVar36);
                                            M.x[0][0] = 1.0;
                                            M.x[0][1] = 2.0;
                                            M.x[0][2] = 3.0;
                                            M.x[0][3] = 5.0;
                                            b2.min.x = 0.0;
                                            b2.min.y = 0.0;
                                            M.x[1][0] = 4.0;
                                            M.x[1][1] = 6.0;
                                            b2.min.z = 0.0;
                                            Imath_3_2::closestPointOnBox<float>
                                                      ((Imath_3_2 *)&ray,&b2.min,
                                                       (Box<Imath_3_2::Vec3<float>_> *)&M);
                                            if ((ray.pos.x == 1.0) && (!NAN(ray.pos.x))) {
                                              if ((ray.pos.y == 2.0) &&
                                                 (((!NAN(ray.pos.y) && (ray.pos.z == 3.0)) &&
                                                  (!NAN(ray.pos.z))))) {
                                                b2.min.x = 0.0;
                                                b2.min.y = 0.0;
                                                b2.min.z = 0.0;
                                                Imath_3_2::clip<Imath_3_2::Vec3<float>>
                                                          (&b2.min,(Box<Imath_3_2::Vec3<float>_> *)
                                                                   &M);
                                                if ((ray.pos.x == 1.0) && (!NAN(ray.pos.x))) {
                                                  if (((ray.pos.y == 2.0) &&
                                                      ((!NAN(ray.pos.y) && (ray.pos.z == 3.0)))) &&
                                                     (!NAN(ray.pos.z))) {
                                                    b2.min.x = 7.0;
                                                    b2.min.y = 7.0;
                                                    b2.min.z = 7.0;
                                                    Imath_3_2::closestPointOnBox<float>
                                                              ((Imath_3_2 *)&ray,&b2.min,
                                                               (Box<Imath_3_2::Vec3<float>_> *)&M);
                                                    if ((ray.pos.x == 5.0) && (!NAN(ray.pos.x))) {
                                                      if ((ray.pos.y == 4.0) &&
                                                         (((!NAN(ray.pos.y) && (ray.pos.z == 6.0))
                                                          && (!NAN(ray.pos.z))))) {
                                                        b2.min.x = 7.0;
                                                        b2.min.y = 7.0;
                                                        b2.min.z = 7.0;
                                                        Imath_3_2::clip<Imath_3_2::Vec3<float>>
                                                                  (&b2.min,(
                                                  Box<Imath_3_2::Vec3<float>_> *)&M);
                                                  if ((ray.pos.x == 5.0) && (!NAN(ray.pos.x))) {
                                                    if (((ray.pos.y == 4.0) &&
                                                        ((!NAN(ray.pos.y) && (ray.pos.z == 6.0))))
                                                       && (!NAN(ray.pos.z))) {
                                                      b2.min.x = 2.0;
                                                      b2.min.y = 3.0;
                                                      b2.min.z = 0.0;
                                                      Imath_3_2::closestPointOnBox<float>
                                                                ((Imath_3_2 *)&ray,&b2.min,
                                                                 (Box<Imath_3_2::Vec3<float>_> *)&M)
                                                      ;
                                                      if ((ray.pos.x == 2.0) && (!NAN(ray.pos.x))) {
                                                        if ((ray.pos.y == 3.0) &&
                                                           (((!NAN(ray.pos.y) && (ray.pos.z == 3.0))
                                                            && (!NAN(ray.pos.z))))) {
                                                          b2.min.x = 2.0;
                                                          b2.min.y = 3.0;
                                                          b2.min.z = 0.0;
                                                          Imath_3_2::clip<Imath_3_2::Vec3<float>>
                                                                    (&b2.min,(
                                                  Box<Imath_3_2::Vec3<float>_> *)&M);
                                                  if ((ray.pos.x == 2.0) && (!NAN(ray.pos.x))) {
                                                    if (((ray.pos.y == 3.0) &&
                                                        ((!NAN(ray.pos.y) && (ray.pos.z == 3.0))))
                                                       && (!NAN(ray.pos.z))) {
                                                      b2.min.x = 2.0;
                                                      b2.min.y = 3.0;
                                                      b2.min.z = 7.0;
                                                      Imath_3_2::closestPointOnBox<float>
                                                                ((Imath_3_2 *)&ray,&b2.min,
                                                                 (Box<Imath_3_2::Vec3<float>_> *)&M)
                                                      ;
                                                      if ((ray.pos.x == 2.0) && (!NAN(ray.pos.x))) {
                                                        if ((ray.pos.y == 3.0) &&
                                                           (((!NAN(ray.pos.y) && (ray.pos.z == 6.0))
                                                            && (!NAN(ray.pos.z))))) {
                                                          b2.min.x = 2.0;
                                                          b2.min.y = 3.0;
                                                          b2.min.z = 7.0;
                                                          Imath_3_2::clip<Imath_3_2::Vec3<float>>
                                                                    (&b2.min,(
                                                  Box<Imath_3_2::Vec3<float>_> *)&M);
                                                  if ((ray.pos.x == 2.0) && (!NAN(ray.pos.x))) {
                                                    if (((ray.pos.y == 3.0) &&
                                                        ((!NAN(ray.pos.y) && (ray.pos.z == 6.0))))
                                                       && (!NAN(ray.pos.z))) {
                                                      b2.min.x = 2.0;
                                                      b2.min.y = 0.0;
                                                      b2.min.z = 4.0;
                                                      Imath_3_2::closestPointOnBox<float>
                                                                ((Imath_3_2 *)&ray,&b2.min,
                                                                 (Box<Imath_3_2::Vec3<float>_> *)&M)
                                                      ;
                                                      if ((ray.pos.x == 2.0) && (!NAN(ray.pos.x))) {
                                                        if ((ray.pos.y == 2.0) &&
                                                           (((!NAN(ray.pos.y) && (ray.pos.z == 4.0))
                                                            && (!NAN(ray.pos.z))))) {
                                                          b2.min.x = 2.0;
                                                          b2.min.y = 0.0;
                                                          b2.min.z = 4.0;
                                                          Imath_3_2::clip<Imath_3_2::Vec3<float>>
                                                                    (&b2.min,(
                                                  Box<Imath_3_2::Vec3<float>_> *)&M);
                                                  if ((ray.pos.x == 2.0) && (!NAN(ray.pos.x))) {
                                                    if (((ray.pos.y == 2.0) &&
                                                        ((!NAN(ray.pos.y) && (ray.pos.z == 4.0))))
                                                       && (!NAN(ray.pos.z))) {
                                                      b2.min.x = 2.0;
                                                      b2.min.y = 7.0;
                                                      b2.min.z = 4.0;
                                                      Imath_3_2::closestPointOnBox<float>
                                                                ((Imath_3_2 *)&ray,&b2.min,
                                                                 (Box<Imath_3_2::Vec3<float>_> *)&M)
                                                      ;
                                                      if ((ray.pos.x == 2.0) && (!NAN(ray.pos.x))) {
                                                        if ((ray.pos.y == 4.0) &&
                                                           (((!NAN(ray.pos.y) && (ray.pos.z == 4.0))
                                                            && (!NAN(ray.pos.z))))) {
                                                          b2.min.x = 2.0;
                                                          b2.min.y = 7.0;
                                                          b2.min.z = 4.0;
                                                          Imath_3_2::clip<Imath_3_2::Vec3<float>>
                                                                    (&b2.min,(
                                                  Box<Imath_3_2::Vec3<float>_> *)&M);
                                                  if ((ray.pos.x == 2.0) && (!NAN(ray.pos.x))) {
                                                    if (((ray.pos.y == 4.0) &&
                                                        ((!NAN(ray.pos.y) && (ray.pos.z == 4.0))))
                                                       && (!NAN(ray.pos.z))) {
                                                      b2.min.x = 0.0;
                                                      b2.min.y = 3.0;
                                                      b2.min.z = 4.0;
                                                      Imath_3_2::closestPointOnBox<float>
                                                                ((Imath_3_2 *)&ray,&b2.min,
                                                                 (Box<Imath_3_2::Vec3<float>_> *)&M)
                                                      ;
                                                      if ((ray.pos.x == 1.0) && (!NAN(ray.pos.x))) {
                                                        if ((ray.pos.y == 3.0) &&
                                                           (((!NAN(ray.pos.y) && (ray.pos.z == 4.0))
                                                            && (!NAN(ray.pos.z))))) {
                                                          b2.min.x = 0.0;
                                                          b2.min.y = 3.0;
                                                          b2.min.z = 4.0;
                                                          Imath_3_2::clip<Imath_3_2::Vec3<float>>
                                                                    (&b2.min,(
                                                  Box<Imath_3_2::Vec3<float>_> *)&M);
                                                  if ((ray.pos.x == 1.0) && (!NAN(ray.pos.x))) {
                                                    if ((ray.pos.y == 3.0) &&
                                                       (((!NAN(ray.pos.y) && (ray.pos.z == 4.0)) &&
                                                        (!NAN(ray.pos.z))))) {
                                                      b2.min.x = 7.0;
                                                      b2.min.y = 3.0;
                                                      b2.min.z = 4.0;
                                                      Imath_3_2::closestPointOnBox<float>
                                                                ((Imath_3_2 *)&ray,&b2.min,
                                                                 (Box<Imath_3_2::Vec3<float>_> *)&M)
                                                      ;
                                                      if ((ray.pos.x == 5.0) && (!NAN(ray.pos.x))) {
                                                        if ((ray.pos.y == 3.0) &&
                                                           (((!NAN(ray.pos.y) && (ray.pos.z == 4.0))
                                                            && (!NAN(ray.pos.z))))) {
                                                          b2.min.x = 7.0;
                                                          b2.min.y = 3.0;
                                                          b2.min.z = 4.0;
                                                          Imath_3_2::clip<Imath_3_2::Vec3<float>>
                                                                    (&b2.min,(
                                                  Box<Imath_3_2::Vec3<float>_> *)&M);
                                                  if ((ray.pos.x == 5.0) && (!NAN(ray.pos.x))) {
                                                    if (((ray.pos.y == 3.0) &&
                                                        ((!NAN(ray.pos.y) && (ray.pos.z == 4.0))))
                                                       && (!NAN(ray.pos.z))) {
                                                      b2.min.x = 1.5;
                                                      b2.min.y = 3.0;
                                                      b2.min.z = 5.0;
                                                      Imath_3_2::closestPointOnBox<float>
                                                                ((Imath_3_2 *)&ray,&b2.min,
                                                                 (Box<Imath_3_2::Vec3<float>_> *)&M)
                                                      ;
                                                      if ((ray.pos.x == 1.0) && (!NAN(ray.pos.x))) {
                                                        if ((ray.pos.y == 3.0) &&
                                                           (((!NAN(ray.pos.y) && (ray.pos.z == 5.0))
                                                            && (!NAN(ray.pos.z))))) {
                                                          b2.min.x = 1.5;
                                                          b2.min.y = 3.0;
                                                          b2.min.z = 5.0;
                                                          Imath_3_2::clip<Imath_3_2::Vec3<float>>
                                                                    (&b2.min,(
                                                  Box<Imath_3_2::Vec3<float>_> *)&M);
                                                  if ((ray.pos.x == 1.5) && (!NAN(ray.pos.x))) {
                                                    if (((ray.pos.y == 3.0) &&
                                                        ((!NAN(ray.pos.y) && (ray.pos.z == 5.0))))
                                                       && (!NAN(ray.pos.z))) {
                                                      b2.min.x = 4.5;
                                                      b2.min.y = 3.0;
                                                      b2.min.z = 5.0;
                                                      Imath_3_2::closestPointOnBox<float>
                                                                ((Imath_3_2 *)&ray,&b2.min,
                                                                 (Box<Imath_3_2::Vec3<float>_> *)&M)
                                                      ;
                                                      if ((ray.pos.x == 5.0) && (!NAN(ray.pos.x))) {
                                                        if ((ray.pos.y == 3.0) &&
                                                           (((!NAN(ray.pos.y) && (ray.pos.z == 5.0))
                                                            && (!NAN(ray.pos.z))))) {
                                                          b2.min.x = 4.5;
                                                          b2.min.y = 3.0;
                                                          b2.min.z = 5.0;
                                                          Imath_3_2::clip<Imath_3_2::Vec3<float>>
                                                                    (&b2.min,(
                                                  Box<Imath_3_2::Vec3<float>_> *)&M);
                                                  if ((ray.pos.x == 4.5) && (!NAN(ray.pos.x))) {
                                                    if (((ray.pos.y == 3.0) &&
                                                        ((!NAN(ray.pos.y) && (ray.pos.z == 5.0))))
                                                       && (!NAN(ray.pos.z))) {
                                                      b2.min.x = 2.0;
                                                      b2.min.y = 2.5;
                                                      b2.min.z = 4.0;
                                                      Imath_3_2::closestPointOnBox<float>
                                                                ((Imath_3_2 *)&ray,&b2.min,
                                                                 (Box<Imath_3_2::Vec3<float>_> *)&M)
                                                      ;
                                                      if ((ray.pos.x == 2.0) && (!NAN(ray.pos.x))) {
                                                        if ((ray.pos.y == 2.0) &&
                                                           (((!NAN(ray.pos.y) && (ray.pos.z == 4.0))
                                                            && (!NAN(ray.pos.z))))) {
                                                          b2.min.x = 2.0;
                                                          b2.min.y = 2.5;
                                                          b2.min.z = 4.0;
                                                          Imath_3_2::clip<Imath_3_2::Vec3<float>>
                                                                    (&b2.min,(
                                                  Box<Imath_3_2::Vec3<float>_> *)&M);
                                                  if ((ray.pos.x == 2.0) && (!NAN(ray.pos.x))) {
                                                    if (((ray.pos.y == 2.5) &&
                                                        ((!NAN(ray.pos.y) && (ray.pos.z == 4.0))))
                                                       && (!NAN(ray.pos.z))) {
                                                      b2.min.x = 2.0;
                                                      b2.min.y = 3.5;
                                                      b2.min.z = 4.0;
                                                      Imath_3_2::closestPointOnBox<float>
                                                                ((Imath_3_2 *)&ray,&b2.min,
                                                                 (Box<Imath_3_2::Vec3<float>_> *)&M)
                                                      ;
                                                      if ((ray.pos.x == 2.0) && (!NAN(ray.pos.x))) {
                                                        if ((ray.pos.y == 4.0) &&
                                                           (((!NAN(ray.pos.y) && (ray.pos.z == 4.0))
                                                            && (!NAN(ray.pos.z))))) {
                                                          b2.min.x = 2.0;
                                                          b2.min.y = 3.5;
                                                          b2.min.z = 4.0;
                                                          Imath_3_2::clip<Imath_3_2::Vec3<float>>
                                                                    (&b2.min,(
                                                  Box<Imath_3_2::Vec3<float>_> *)&M);
                                                  if ((ray.pos.x == 2.0) && (!NAN(ray.pos.x))) {
                                                    if (((ray.pos.y == 3.5) &&
                                                        ((!NAN(ray.pos.y) && (ray.pos.z == 4.0))))
                                                       && (!NAN(ray.pos.z))) {
                                                      b2.min.x = 2.0;
                                                      b2.min.y = 3.0;
                                                      b2.min.z = 3.5;
                                                      Imath_3_2::closestPointOnBox<float>
                                                                ((Imath_3_2 *)&ray,&b2.min,
                                                                 (Box<Imath_3_2::Vec3<float>_> *)&M)
                                                      ;
                                                      if ((ray.pos.x == 2.0) && (!NAN(ray.pos.x))) {
                                                        if ((ray.pos.y == 3.0) &&
                                                           (((!NAN(ray.pos.y) && (ray.pos.z == 3.0))
                                                            && (!NAN(ray.pos.z))))) {
                                                          b2.min.x = 2.0;
                                                          b2.min.y = 3.0;
                                                          b2.min.z = 3.5;
                                                          Imath_3_2::clip<Imath_3_2::Vec3<float>>
                                                                    (&b2.min,(
                                                  Box<Imath_3_2::Vec3<float>_> *)&M);
                                                  if ((ray.pos.x == 2.0) && (!NAN(ray.pos.x))) {
                                                    if (((ray.pos.y == 3.0) &&
                                                        ((!NAN(ray.pos.y) && (ray.pos.z == 3.5))))
                                                       && (!NAN(ray.pos.z))) {
                                                      b2.min.x = 2.0;
                                                      b2.min.y = 3.0;
                                                      b2.min.z = 5.5;
                                                      Imath_3_2::closestPointOnBox<float>
                                                                ((Imath_3_2 *)&ray,&b2.min,
                                                                 (Box<Imath_3_2::Vec3<float>_> *)&M)
                                                      ;
                                                      if ((ray.pos.x == 2.0) && (!NAN(ray.pos.x))) {
                                                        if ((ray.pos.y == 3.0) &&
                                                           (((!NAN(ray.pos.y) && (ray.pos.z == 6.0))
                                                            && (!NAN(ray.pos.z))))) {
                                                          b2.min.x = 2.0;
                                                          b2.min.y = 3.0;
                                                          b2.min.z = 5.5;
                                                          Imath_3_2::clip<Imath_3_2::Vec3<float>>
                                                                    (&b2.min,(
                                                  Box<Imath_3_2::Vec3<float>_> *)&M);
                                                  if ((ray.pos.x == 2.0) && (!NAN(ray.pos.x))) {
                                                    if ((ray.pos.y == 3.0) &&
                                                       (((!NAN(ray.pos.y) && (ray.pos.z == 5.5)) &&
                                                        (!NAN(ray.pos.z))))) {
                                                      b2.min.x = 3.0;
                                                      b2.min.y = 3.0;
                                                      b2.min.z = 4.5;
                                                      Imath_3_2::closestPointOnBox<float>
                                                                ((Imath_3_2 *)&ray,&b2.min,
                                                                 (Box<Imath_3_2::Vec3<float>_> *)&M)
                                                      ;
                                                      if ((ray.pos.x == 3.0) && (!NAN(ray.pos.x))) {
                                                        if ((ray.pos.y == 4.0) &&
                                                           (((!NAN(ray.pos.y) && (ray.pos.z == 4.5))
                                                            && (!NAN(ray.pos.z))))) {
                                                          b2.min.x = 3.0;
                                                          b2.min.y = 3.0;
                                                          b2.min.z = 4.5;
                                                          Imath_3_2::clip<Imath_3_2::Vec3<float>>
                                                                    (&b2.min,(
                                                  Box<Imath_3_2::Vec3<float>_> *)&M);
                                                  if ((ray.pos.x == 3.0) && (!NAN(ray.pos.x))) {
                                                    if ((ray.pos.y == 3.0) &&
                                                       (((!NAN(ray.pos.y) && (ray.pos.z == 4.5)) &&
                                                        (!NAN(ray.pos.z))))) {
                                                      poVar36 = std::operator<<((ostream *)
                                                                                &std::cout,"ok\n");
                                                      std::endl<char,std::char_traits<char>>
                                                                (poVar36);
                                                      return;
                                                    }
                                                  }
                                                  __assert_fail(
                                                  "closestPointInBox (V3f (3, 3, 4.5), box) == V3f (3, 3, 4.5)"
                                                  ,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBoxAlgo.cpp"
                                                  ,0x395,
                                                  "void (anonymous namespace)::pointInAndOnBox()");
                                                  }
                                                  }
                                                  __assert_fail(
                                                  "closestPointOnBox (V3f (3, 3, 4.5), box) == V3f (3, 4, 4.5)"
                                                  ,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBoxAlgo.cpp"
                                                  ,0x394,
                                                  "void (anonymous namespace)::pointInAndOnBox()");
                                                  }
                                                  }
                                                  __assert_fail(
                                                  "closestPointInBox (V3f (2, 3, 5.5), box) == V3f (2, 3, 5.5)"
                                                  ,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBoxAlgo.cpp"
                                                  ,0x38d,
                                                  "void (anonymous namespace)::pointInAndOnBox()");
                                                  }
                                                  }
                                                  __assert_fail(
                                                  "closestPointOnBox (V3f (2, 3, 5.5), box) == V3f (2, 3, 6)"
                                                  ,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBoxAlgo.cpp"
                                                  ,0x38c,
                                                  "void (anonymous namespace)::pointInAndOnBox()");
                                                  }
                                                  }
                                                  __assert_fail(
                                                  "closestPointInBox (V3f (2, 3, 3.5), box) == V3f (2, 3, 3.5)"
                                                  ,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBoxAlgo.cpp"
                                                  ,0x38b,
                                                  "void (anonymous namespace)::pointInAndOnBox()");
                                                  }
                                                  }
                                                  __assert_fail(
                                                  "closestPointOnBox (V3f (2, 3, 3.5), box) == V3f (2, 3, 3)"
                                                  ,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBoxAlgo.cpp"
                                                  ,0x38a,
                                                  "void (anonymous namespace)::pointInAndOnBox()");
                                                  }
                                                  }
                                                  __assert_fail(
                                                  "closestPointInBox (V3f (2, 3.5, 4), box) == V3f (2, 3.5, 4)"
                                                  ,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBoxAlgo.cpp"
                                                  ,0x388,
                                                  "void (anonymous namespace)::pointInAndOnBox()");
                                                  }
                                                  }
                                                  __assert_fail(
                                                  "closestPointOnBox (V3f (2, 3.5, 4), box) == V3f (2, 4, 4)"
                                                  ,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBoxAlgo.cpp"
                                                  ,0x387,
                                                  "void (anonymous namespace)::pointInAndOnBox()");
                                                  }
                                                  }
                                                  __assert_fail(
                                                  "closestPointInBox (V3f (2, 2.5, 4), box) == V3f (2, 2.5, 4)"
                                                  ,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBoxAlgo.cpp"
                                                  ,0x386,
                                                  "void (anonymous namespace)::pointInAndOnBox()");
                                                  }
                                                  }
                                                  __assert_fail(
                                                  "closestPointOnBox (V3f (2, 2.5, 4), box) == V3f (2, 2, 4)"
                                                  ,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBoxAlgo.cpp"
                                                  ,0x385,
                                                  "void (anonymous namespace)::pointInAndOnBox()");
                                                  }
                                                  }
                                                  __assert_fail(
                                                  "closestPointInBox (V3f (4.5, 3, 5), box) == V3f (4.5, 3, 5)"
                                                  ,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBoxAlgo.cpp"
                                                  ,899,
                                                  "void (anonymous namespace)::pointInAndOnBox()");
                                                  }
                                                  }
                                                  __assert_fail(
                                                  "closestPointOnBox (V3f (4.5, 3, 5), box) == V3f (5, 3, 5)"
                                                  ,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBoxAlgo.cpp"
                                                  ,0x382,
                                                  "void (anonymous namespace)::pointInAndOnBox()");
                                                  }
                                                  }
                                                  __assert_fail(
                                                  "closestPointInBox (V3f (1.5, 3, 5), box) == V3f (1.5, 3, 5)"
                                                  ,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBoxAlgo.cpp"
                                                  ,0x381,
                                                  "void (anonymous namespace)::pointInAndOnBox()");
                                                  }
                                                  }
                                                  __assert_fail(
                                                  "closestPointOnBox (V3f (1.5, 3, 5), box) == V3f (1, 3, 5)"
                                                  ,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBoxAlgo.cpp"
                                                  ,0x380,
                                                  "void (anonymous namespace)::pointInAndOnBox()");
                                                  }
                                                  }
                                                  __assert_fail(
                                                  "closestPointInBox (V3f (7, 3, 4), box) == V3f (5, 3, 4)"
                                                  ,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBoxAlgo.cpp"
                                                  ,0x37a,
                                                  "void (anonymous namespace)::pointInAndOnBox()");
                                                  }
                                                  }
                                                  __assert_fail(
                                                  "closestPointOnBox (V3f (7, 3, 4), box) == V3f (5, 3, 4)"
                                                  ,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBoxAlgo.cpp"
                                                  ,0x379,
                                                  "void (anonymous namespace)::pointInAndOnBox()");
                                                  }
                                                  }
                                                  __assert_fail(
                                                  "closestPointInBox (V3f (0, 3, 4), box) == V3f (1, 3, 4)"
                                                  ,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBoxAlgo.cpp"
                                                  ,0x378,
                                                  "void (anonymous namespace)::pointInAndOnBox()");
                                                  }
                                                  }
                                                  __assert_fail(
                                                  "closestPointOnBox (V3f (0, 3, 4), box) == V3f (1, 3, 4)"
                                                  ,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBoxAlgo.cpp"
                                                  ,0x377,
                                                  "void (anonymous namespace)::pointInAndOnBox()");
                                                  }
                                                  }
                                                  __assert_fail(
                                                  "closestPointInBox (V3f (2, 7, 4), box) == V3f (2, 4, 4)"
                                                  ,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBoxAlgo.cpp"
                                                  ,0x375,
                                                  "void (anonymous namespace)::pointInAndOnBox()");
                                                  }
                                                  }
                                                  __assert_fail(
                                                  "closestPointOnBox (V3f (2, 7, 4), box) == V3f (2, 4, 4)"
                                                  ,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBoxAlgo.cpp"
                                                  ,0x374,
                                                  "void (anonymous namespace)::pointInAndOnBox()");
                                                  }
                                                  }
                                                  __assert_fail(
                                                  "closestPointInBox (V3f (2, 0, 4), box) == V3f (2, 2, 4)"
                                                  ,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBoxAlgo.cpp"
                                                  ,0x373,
                                                  "void (anonymous namespace)::pointInAndOnBox()");
                                                  }
                                                  }
                                                  __assert_fail(
                                                  "closestPointOnBox (V3f (2, 0, 4), box) == V3f (2, 2, 4)"
                                                  ,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBoxAlgo.cpp"
                                                  ,0x372,
                                                  "void (anonymous namespace)::pointInAndOnBox()");
                                                  }
                                                  }
                                                  __assert_fail(
                                                  "closestPointInBox (V3f (2, 3, 7), box) == V3f (2, 3, 6)"
                                                  ,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBoxAlgo.cpp"
                                                  ,0x370,
                                                  "void (anonymous namespace)::pointInAndOnBox()");
                                                  }
                                                  }
                                                  __assert_fail(
                                                  "closestPointOnBox (V3f (2, 3, 7), box) == V3f (2, 3, 6)"
                                                  ,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBoxAlgo.cpp"
                                                  ,0x36f,
                                                  "void (anonymous namespace)::pointInAndOnBox()");
                                                  }
                                                  }
                                                  __assert_fail(
                                                  "closestPointInBox (V3f (2, 3, 0), box) == V3f (2, 3, 3)"
                                                  ,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBoxAlgo.cpp"
                                                  ,0x36e,
                                                  "void (anonymous namespace)::pointInAndOnBox()");
                                                  }
                                                  }
                                                  __assert_fail(
                                                  "closestPointOnBox (V3f (2, 3, 0), box) == V3f (2, 3, 3)"
                                                  ,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBoxAlgo.cpp"
                                                  ,0x36d,
                                                  "void (anonymous namespace)::pointInAndOnBox()");
                                                  }
                                                  }
                                                  __assert_fail(
                                                  "closestPointInBox (V3f (7, 7, 7), box) == V3f (5, 4, 6)"
                                                  ,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBoxAlgo.cpp"
                                                  ,0x36b,
                                                  "void (anonymous namespace)::pointInAndOnBox()");
                                                  }
                                                  }
                                                  __assert_fail(
                                                  "closestPointOnBox (V3f (7, 7, 7), box) == V3f (5, 4, 6)"
                                                  ,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBoxAlgo.cpp"
                                                  ,0x36a,
                                                  "void (anonymous namespace)::pointInAndOnBox()");
                                                  }
                                                }
                                                __assert_fail(
                                                  "closestPointInBox (V3f (0, 0, 0), box) == V3f (1, 2, 3)"
                                                  ,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBoxAlgo.cpp"
                                                  ,0x369,
                                                  "void (anonymous namespace)::pointInAndOnBox()");
                                              }
                                            }
                                            __assert_fail(
                                                  "closestPointOnBox (V3f (0, 0, 0), box) == V3f (1, 2, 3)"
                                                  ,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBoxAlgo.cpp"
                                                  ,0x368,
                                                  "void (anonymous namespace)::pointInAndOnBox()");
                                          }
                                        }
                                      }
                                    }
                                    __assert_fail("b8.isInfinite() && !b8.isEmpty()",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBoxAlgo.cpp"
                                                  ,0x358,
                                                  "void (anonymous namespace)::boxMatrixTransform()"
                                                 );
                                  }
                                  __assert_fail("b51 == b5",
                                                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBoxAlgo.cpp"
                                                ,0x34d,
                                                "void (anonymous namespace)::boxMatrixTransform()");
                                }
                                lVar37 = lVar38 * 0x18;
                                pBVar41 = (Box<Imath_3_2::Vec3<float>_> *)((long)M.x + lVar37);
                                random._state[0] = 0xf8c9;
                                random._state[1] = 0xfe47;
                                random._state[2] = 0xf8c9;
                                bVar35 = Imath_3_2::Box<Imath_3_2::Vec3<float>_>::isEmpty(pBVar41);
                                local_200 = lVar38;
                                if (bVar35) {
                                  poVar36 = std::operator<<((ostream *)&std::cout,
                                                            "    empty box, no rays intersect");
                                  std::endl<char,std::char_traits<char>>(poVar36);
                                  iVar42 = 100000;
                                  while (bVar35 = iVar42 != 0, iVar42 = iVar42 + -1, bVar35) {
                                    dVar26 = Imath_3_2::Rand48::nextf
                                                       (&random,(double)*(float *)((long)M.x +
                                                                                  lVar37 + 0xc),
                                                        (double)(pBVar41->min).x);
                                    dVar27 = Imath_3_2::Rand48::nextf
                                                       (&random,(double)*(float *)((long)M.x +
                                                                                  lVar37 + 0x10),
                                                        (double)*(float *)((long)M.x + lVar37 + 4));
                                    dVar28 = Imath_3_2::Rand48::nextf
                                                       (&random,(double)*(float *)((long)M.x +
                                                                                  lVar37 + 0x14),
                                                        (double)*(float *)((long)M.x + lVar37 + 8));
                                    b2.min.z = (float)dVar28;
                                    b2.min.y = (float)dVar27;
                                    b2.min.x = (float)dVar26;
                                    Imath_3_2::
                                    hollowSphereRand<Imath_3_2::Vec3<float>,Imath_3_2::Rand48>
                                              ((Imath_3_2 *)&ray,&random);
                                    r_1.z = b2.min.z + ray.pos.z;
                                    r_1.x = ray.pos.x + b2.min.x;
                                    r_1.y = ray.pos.y + b2.min.y;
                                    Imath_3_2::Line3<float>::set(&ray,&b2.min,&r_1);
                                    bVar35 = Imath_3_2::intersects<float>(pBVar41,&ray,&r);
                                    if (bVar35) {
                                      __assert_fail("!intersects (box, Line3f (p1, p2), ip)",
                                                                                                        
                                                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBoxAlgo.cpp"
                                                  ,0x1b1,
                                                  "void (anonymous namespace)::testRayBoxIntersection(const Box3f &)"
                                                  );
                                    }
                                  }
                                }
                                else {
                                  poVar36 = std::operator<<((ostream *)&std::cout,"    box = (");
                                  poVar36 = Imath_3_2::operator<<(poVar36,(Vec3<float> *)pBVar41);
                                  poVar36 = std::operator<<(poVar36," ");
                                  v = (Vec3<float> *)((long)M.x + lVar37 + 0xc);
                                  poVar36 = Imath_3_2::operator<<(poVar36,v);
                                  poVar36 = std::operator<<(poVar36,")");
                                  std::endl<char,std::char_traits<char>>(poVar36);
                                  bVar35 = Imath_3_2::Vec3<float>::operator==
                                                     (v,(Vec3<float> *)pBVar41);
                                  if (bVar35) {
                                    poVar36 = std::operator<<((ostream *)&std::cout,
                                                              "    single-point box, ray intersects"
                                                             );
                                    std::endl<char,std::char_traits<char>>(poVar36);
                                    for (lVar38 = 8; lVar38 != 0x50; lVar38 = lVar38 + 0xc) {
                                      b2.min.z = *(float *)((long)M.x + lVar37 + 8) +
                                                 *(float *)((long)&(anonymous_namespace)::
                                                                                                                                      
                                                  testRayBoxIntersection(Imath_3_2::Box<Imath_3_2::Vec3<float>>const&)
                                                  ::off + lVar38);
                                      uVar10 = (pBVar41->min).x;
                                      uVar21 = (pBVar41->min).y;
                                      b2.min.y = (float)((ulong)*(undefined8 *)
                                                                 (&UNK_00157a38 + lVar38) >> 0x20) +
                                                 (float)uVar21;
                                      b2.min.x = (float)*(undefined8 *)(&UNK_00157a38 + lVar38) +
                                                 (float)uVar10;
                                      Imath_3_2::Line3<float>::set
                                                (&ray,&b2.min,(Vec3<float> *)pBVar41);
                                      bVar35 = Imath_3_2::intersects<float>(pBVar41,&ray,&r_1);
                                      if (!bVar35) {
                                        __assert_fail("intersects (box, Line3f (p1, box.min), ip)",
                                                                                                            
                                                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBoxAlgo.cpp"
                                                  ,0x1cd,
                                                  "void (anonymous namespace)::testRayBoxIntersection(const Box3f &)"
                                                  );
                                      }
                                      if (((((r_1.x != (pBVar41->min).x) ||
                                            (NAN(r_1.x) || NAN((pBVar41->min).x))) ||
                                           (pfVar1 = (float *)((long)M.x + lVar37 + 4),
                                           r_1.y != *pfVar1)) ||
                                          ((NAN(r_1.y) || NAN(*pfVar1) ||
                                           (pfVar1 = (float *)((long)M.x + lVar37 + 8),
                                           r_1.z != *pfVar1)))) || (NAN(r_1.z) || NAN(*pfVar1))) {
                                        __assert_fail("ip == box.min",
                                                                                                            
                                                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBoxAlgo.cpp"
                                                  ,0x1ce,
                                                  "void (anonymous namespace)::testRayBoxIntersection(const Box3f &)"
                                                  );
                                      }
                                    }
                                    poVar36 = std::operator<<((ostream *)&std::cout,
                                                                                                                            
                                                  "    single-point box, ray does not intersect");
                                    std::endl<char,std::char_traits<char>>(poVar36);
                                    for (iVar42 = 0; iVar42 != 100000; iVar42 = iVar42 + 1) {
                                      Imath_3_2::
                                      hollowSphereRand<Imath_3_2::Vec3<float>,Imath_3_2::Rand48>
                                                ((Imath_3_2 *)&ray,&random);
                                      b2.min.z = ray.pos.z + *(float *)((long)M.x + lVar37 + 8);
                                      uVar11 = (pBVar41->min).x;
                                      uVar22 = (pBVar41->min).y;
                                      b2.min.y = (float)uVar22 + ray.pos.y;
                                      b2.min.x = (float)uVar11 + ray.pos.x;
                                      do {
                                        do {
                                          Imath_3_2::
                                          hollowSphereRand<Imath_3_2::Vec3<float>,Imath_3_2::Rand48>
                                                    ((Imath_3_2 *)&ray,&random);
                                          uVar12 = (pBVar41->min).x;
                                          uVar23 = (pBVar41->min).y;
                                          fVar46 = (float)uVar12 + ray.pos.x;
                                          fVar47 = (float)uVar23 + ray.pos.y;
                                          fVar45 = ray.pos.z + *(float *)((long)M.x + lVar37 + 8);
                                          r_1.x = fVar46;
                                          r_1.y = fVar47;
                                          r_1.z = fVar45;
                                          bVar35 = anon_unknown.dwarf_463b6::approximatelyEqual
                                                             (&b2.min,&r_1,5.9604645e-06);
                                        } while (bVar35);
                                        r.z = fVar45 - b2.min.z;
                                        r.y = fVar47 - b2.min.y;
                                        r.x = fVar46 - b2.min.x;
                                        Imath_3_2::Vec3<float>::normalized(&ray.pos);
                                        fVar45 = *(float *)((long)M.x + lVar37 + 8) - b2.min.z;
                                        uVar13 = (pBVar41->min).x;
                                        uVar24 = (pBVar41->min).y;
                                        fVar46 = (float)uVar13 - b2.min.x;
                                        fVar47 = (float)uVar24 - b2.min.y;
                                        fVar49 = ray.pos.z * fVar45 +
                                                 ray.pos.x * fVar46 + fVar47 * ray.pos.y;
                                        r.z = fVar45 - ray.pos.z * fVar49;
                                        r.y = fVar47 - fVar49 * ray.pos.y;
                                        r.x = fVar46 - fVar49 * ray.pos.x;
                                        fVar45 = Imath_3_2::Vec3<float>::length(&r);
                                      } while (fVar45 < 1e-05);
                                      Imath_3_2::Line3<float>::set(&ray,&b2.min,&r_1);
                                      bVar35 = Imath_3_2::intersects<float>(pBVar41,&ray,&r);
                                      if (bVar35) {
                                        __assert_fail("!intersects (box, ray, ip)",
                                                                                                            
                                                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBoxAlgo.cpp"
                                                  ,0x1f0,
                                                  "void (anonymous namespace)::testRayBoxIntersection(const Box3f &)"
                                                  );
                                      }
                                    }
                                  }
                                  else {
                                    poVar36 = std::operator<<((ostream *)&std::cout,
                                                              "    ray starts inside box");
                                    std::endl<char,std::char_traits<char>>(poVar36);
                                    iVar42 = 1000;
                                    while (bVar35 = iVar42 != 0, iVar42 = iVar42 + -1, bVar35) {
                                      dVar26 = Imath_3_2::Rand48::nextf
                                                         (&random,(double)(pBVar41->min).x,
                                                          (double)*(float *)((long)M.x +
                                                                            lVar37 + 0xc));
                                      dVar27 = Imath_3_2::Rand48::nextf
                                                         (&random,(double)*(float *)((long)M.x +
                                                                                    lVar37 + 4),
                                                          (double)*(float *)((long)M.x +
                                                                            lVar37 + 0x10));
                                      dVar28 = Imath_3_2::Rand48::nextf
                                                         (&random,(double)*(float *)((long)M.x +
                                                                                    lVar37 + 8),
                                                          (double)*(float *)((long)M.x +
                                                                            lVar37 + 0x14));
                                      b2.min.z = (float)dVar28;
                                      b2.min.y = (float)dVar27;
                                      b2.min.x = (float)dVar26;
                                      Imath_3_2::
                                      hollowSphereRand<Imath_3_2::Vec3<float>,Imath_3_2::Rand48>
                                                ((Imath_3_2 *)&ray,&random);
                                      r_1.z = b2.min.z + ray.pos.z;
                                      r_1.x = ray.pos.x + b2.min.x;
                                      r_1.y = ray.pos.y + b2.min.y;
                                      Imath_3_2::Line3<float>::set(&ray,&b2.min,&r_1);
                                      bVar35 = Imath_3_2::intersects<float>(pBVar41,&ray,&r);
                                      if (!bVar35) goto LAB_0011de60;
                                      if ((r.x != b2.min.x) || (NAN(r.x) || NAN(b2.min.x)))
                                      goto LAB_0011de60;
                                      if ((r.y != b2.min.y) || (NAN(r.y) || NAN(b2.min.y)))
                                      goto LAB_0011de60;
                                      if ((r.z != b2.min.z) || (NAN(r.z) || NAN(b2.min.z))) {
LAB_0011de60:
                                        __assert_fail("b && ip == p1",
                                                                                                            
                                                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBoxAlgo.cpp"
                                                  ,0x204,
                                                  "void (anonymous namespace)::testRayBoxIntersection(const Box3f &)"
                                                  );
                                      }
                                    }
                                    poVar36 = std::operator<<((ostream *)&std::cout,
                                                                                                                            
                                                  "    ray starts outside box, intersects");
                                    std::endl<char,std::char_traits<char>>(poVar36);
                                    fVar45 = *(float *)((long)M.x + lVar37 + 0xc);
                                    fVar46 = (pBVar41->min).x;
                                    fVar47 = *(float *)((long)M.x + lVar37 + 4);
                                    fVar48 = fVar45 - fVar46;
                                    fVar49 = *(float *)((long)M.x + lVar37 + 0x10);
                                    fVar52 = fVar49 - fVar47;
                                    fVar50 = *(float *)((long)M.x + lVar37 + 0x14);
                                    fVar51 = *(float *)((long)M.x + lVar37 + 8);
                                    fVar54 = fVar50 - fVar51;
                                    for (iVar42 = 0; iVar42 != 100000; iVar42 = iVar42 + 1) {
                                      do {
                                        dVar26 = Imath_3_2::Rand48::nextf
                                                           (&random,(double)(fVar46 - fVar48),
                                                            (double)(fVar48 + fVar45));
                                        dVar27 = Imath_3_2::Rand48::nextf
                                                           (&random,(double)(fVar47 - fVar52),
                                                            (double)(fVar52 + fVar49));
                                        dVar28 = Imath_3_2::Rand48::nextf
                                                           (&random,(double)(fVar51 - fVar54),
                                                            (double)(fVar54 + fVar50));
                                        b2.min.z = (float)dVar28;
                                        b2.min.y = (float)dVar27;
                                        b2.min.x = (float)dVar26;
                                        bVar35 = Imath_3_2::Box<Imath_3_2::Vec3<float>_>::intersects
                                                           (pBVar41,&b2.min);
                                      } while (bVar35);
                                      do {
                                        dVar26 = Imath_3_2::Rand48::nextf
                                                           (&random,(double)(pBVar41->min).x,
                                                            (double)*(float *)((long)M.x +
                                                                              lVar37 + 0xc));
                                        dVar27 = Imath_3_2::Rand48::nextf
                                                           (&random,(double)*(float *)((long)M.x +
                                                                                      lVar37 + 4),
                                                            (double)*(float *)((long)M.x +
                                                                              lVar37 + 0x10));
                                        dVar28 = Imath_3_2::Rand48::nextf
                                                           (&random,(double)*(float *)((long)M.x +
                                                                                      lVar37 + 8),
                                                            (double)*(float *)((long)M.x +
                                                                              lVar37 + 0x14));
                                        r_1.z = (float)dVar28;
                                        r_1.x = (float)dVar26;
                                        r_1.y = (float)dVar27;
                                        bVar35 = anon_unknown.dwarf_463b6::approximatelyEqual
                                                           (&b2.min,&r_1,5.9604645e-06);
                                      } while (bVar35);
                                      Imath_3_2::Line3<float>::set(&ray,&b2.min,&r_1);
                                      bVar35 = Imath_3_2::intersects<float>(pBVar41,&ray,&r);
                                      if (!bVar35) {
                                        __assert_fail("b",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBoxAlgo.cpp"
                                                  ,0x22f,
                                                  "void (anonymous namespace)::testRayBoxIntersection(const Box3f &)"
                                                  );
                                      }
                                      fVar43 = (pBVar41->min).x;
                                      fVar53 = *(float *)((long)M.x + lVar37 + 0xc);
                                      if ((r.x != fVar43) || (NAN(r.x) || NAN(fVar43))) {
                                        if ((r.x != fVar53) || (NAN(r.x) || NAN(fVar53))) {
                                          pfVar1 = (float *)((long)M.x + lVar37 + 4);
                                          if ((r.y != *pfVar1) || (NAN(r.y) || NAN(*pfVar1))) {
                                            pfVar1 = (float *)((long)M.x + lVar37 + 0x10);
                                            if ((r.y != *pfVar1) || (NAN(r.y) || NAN(*pfVar1))) {
                                              pfVar1 = (float *)((long)M.x + lVar37 + 8);
                                              if (((r.z != *pfVar1) || (NAN(r.z) || NAN(*pfVar1)))
                                                 && ((pfVar1 = (float *)((long)M.x + lVar37 + 0x14),
                                                     r.z != *pfVar1 || (NAN(r.z) || NAN(*pfVar1)))))
                                              {
                                                __assert_fail(
                                                  "ip.x == box.min.x || ip.x == box.max.x || ip.y == box.min.y || ip.y == box.max.y || ip.z == box.min.z || ip.z == box.max.z"
                                                  ,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBoxAlgo.cpp"
                                                  ,0x233,
                                                  "void (anonymous namespace)::testRayBoxIntersection(const Box3f &)"
                                                  );
                                              }
                                            }
                                          }
                                        }
                                      }
                                      if (((r.x == fVar43) && (!NAN(r.x) && !NAN(fVar43))) &&
                                         ((fVar43 < ray.pos.x || (ray.dir.x < 0.0)))) {
                                        __assert_fail("ray.pos.x <= box.min.x && ray.dir.x >= 0",
                                                                                                            
                                                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBoxAlgo.cpp"
                                                  ,0x23b,
                                                  "void (anonymous namespace)::testRayBoxIntersection(const Box3f &)"
                                                  );
                                      }
                                      if (((r.x == fVar53) && (!NAN(r.x) && !NAN(fVar53))) &&
                                         ((ray.pos.x < fVar53 || (0.0 < ray.dir.x)))) {
                                        __assert_fail("ray.pos.x >= box.max.x && ray.dir.x <= 0",
                                                                                                            
                                                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBoxAlgo.cpp"
                                                  ,0x23e,
                                                  "void (anonymous namespace)::testRayBoxIntersection(const Box3f &)"
                                                  );
                                      }
                                      fVar43 = *(float *)((long)M.x + lVar37 + 4);
                                      if (((r.y == fVar43) && (!NAN(r.y) && !NAN(fVar43))) &&
                                         ((fVar43 < ray.pos.y || (ray.dir.y < 0.0)))) {
                                        __assert_fail("ray.pos.y <= box.min.y && ray.dir.y >= 0",
                                                                                                            
                                                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBoxAlgo.cpp"
                                                  ,0x241,
                                                  "void (anonymous namespace)::testRayBoxIntersection(const Box3f &)"
                                                  );
                                      }
                                      fVar43 = *(float *)((long)M.x + lVar37 + 0x10);
                                      if (((r.y == fVar43) && (!NAN(r.y) && !NAN(fVar43))) &&
                                         ((ray.pos.y < fVar43 || (0.0 < ray.dir.y)))) {
                                        __assert_fail("ray.pos.y >= box.max.y && ray.dir.y <= 0",
                                                                                                            
                                                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBoxAlgo.cpp"
                                                  ,0x244,
                                                  "void (anonymous namespace)::testRayBoxIntersection(const Box3f &)"
                                                  );
                                      }
                                      fVar43 = *(float *)((long)M.x + lVar37 + 8);
                                      if (((r.z == fVar43) && (!NAN(r.z) && !NAN(fVar43))) &&
                                         ((fVar43 < ray.pos.z || (ray.dir.z < 0.0)))) {
                                        __assert_fail("ray.pos.z <= box.min.z && ray.dir.z >= 0",
                                                                                                            
                                                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBoxAlgo.cpp"
                                                  ,0x247,
                                                  "void (anonymous namespace)::testRayBoxIntersection(const Box3f &)"
                                                  );
                                      }
                                      fVar43 = *(float *)((long)M.x + lVar37 + 0x14);
                                      if (((r.z == fVar43) && (!NAN(r.z) && !NAN(fVar43))) &&
                                         ((ray.pos.z < fVar43 || (0.0 < ray.dir.z)))) {
                                        __assert_fail("ray.pos.z >= box.max.z && ray.dir.z <= 0",
                                                                                                            
                                                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBoxAlgo.cpp"
                                                  ,0x24a,
                                                  "void (anonymous namespace)::testRayBoxIntersection(const Box3f &)"
                                                  );
                                      }
                                      fVar43 = (r.z - b2.min.z) * ray.dir.z +
                                               (r.x - b2.min.x) * ray.dir.x +
                                               ray.dir.y * (r.y - b2.min.y);
                                      s.x = fVar43 * ray.dir.x + b2.min.x;
                                      s.y = fVar43 * ray.dir.y + b2.min.y;
                                      stack0xfffffffffffffd00 =
                                           CONCAT44(fStack_2fc,ray.dir.z * fVar43 + b2.min.z);
                                      fVar43 = 0.0;
                                      for (lVar38 = 0; lVar38 != 3; lVar38 = lVar38 + 1) {
                                        fVar53 = ABS((&b2.min.x)[lVar38]);
                                        if (fVar43 <= fVar53) {
                                          fVar43 = fVar53;
                                        }
                                        if (fVar43 <= ABS((&r.x)[lVar38])) {
                                          fVar43 = ABS((&r.x)[lVar38]);
                                        }
                                      }
                                      bVar35 = Imath_3_2::Vec3<float>::equalWithAbsError
                                                         (&s,&r,fVar43 * 30.0 * 1.1920929e-07);
                                      if (!bVar35) {
                                        __assert_fail("p3.equalWithAbsError (ip, err)",
                                                                                                            
                                                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBoxAlgo.cpp"
                                                  ,0x25c,
                                                  "void (anonymous namespace)::testRayBoxIntersection(const Box3f &)"
                                                  );
                                      }
                                      ray.dir.x = -ray.dir.x;
                                      ray.dir.y = -ray.dir.y;
                                      ray.dir.z = -ray.dir.z;
                                      bVar35 = Imath_3_2::intersects<float>(pBVar41,&ray,&ip2);
                                      if (bVar35) {
                                        __assert_fail("!intersects (box, ray, ip2)",
                                                                                                            
                                                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBoxAlgo.cpp"
                                                  ,0x265,
                                                  "void (anonymous namespace)::testRayBoxIntersection(const Box3f &)"
                                                  );
                                      }
                                    }
                                    poVar36 = std::operator<<((ostream *)&std::cout,
                                                                                                                            
                                                  "    ray starts outside box, does not intersect");
                                    std::endl<char,std::char_traits<char>>(poVar36);
                                    uVar14 = (pBVar41->min).x;
                                    uVar25 = (pBVar41->min).y;
                                    uVar15 = *(undefined8 *)((long)M.x + lVar37 + 0xc);
                                    fVar47 = (float)uVar15;
                                    fVar49 = (float)((ulong)uVar15 >> 0x20);
                                    fVar45 = *(float *)((long)M.x + lVar37 + 8);
                                    fVar46 = *(float *)((long)M.x + lVar37 + 0x14);
                                    fVar50 = ((float)uVar14 + fVar47) * 0.5;
                                    fVar51 = ((float)uVar25 + fVar49) * 0.5;
                                    fVar48 = (fVar45 + fVar46) * 0.5;
                                    ray.pos.z = fVar46 - fVar45;
                                    ray.pos.y = fVar49 - (float)uVar25;
                                    ray.pos.x = fVar47 - (float)uVar14;
                                    fVar45 = Imath_3_2::Vec3<float>::length(&ray.pos);
                                    fVar45 = fVar45 * 0.51;
                                    fVar46 = fVar45 + fVar45;
                                    for (iVar42 = 0; iVar42 != 100000; iVar42 = iVar42 + 1) {
                                      Imath_3_2::
                                      hollowSphereRand<Imath_3_2::Vec3<float>,Imath_3_2::Rand48>
                                                ((Imath_3_2 *)&ray,&random);
                                      b2.min.z = ray.pos.z * fVar46 + fVar48;
                                      b2.min.y = ray.pos.y * fVar46 + fVar51;
                                      b2.min.x = ray.pos.x * fVar46 + fVar50;
                                      do {
                                        do {
                                          Imath_3_2::
                                          hollowSphereRand<Imath_3_2::Vec3<float>,Imath_3_2::Rand48>
                                                    ((Imath_3_2 *)&ray,&random);
                                          fVar49 = ray.pos.x * fVar46 + fVar50;
                                          fVar52 = ray.pos.y * fVar46 + fVar51;
                                          fVar47 = ray.pos.z * fVar46 + fVar48;
                                          r_1.x = fVar49;
                                          r_1.y = fVar52;
                                          r_1.z = fVar47;
                                          bVar35 = anon_unknown.dwarf_463b6::approximatelyEqual
                                                             (&b2.min,&r_1,5.9604645e-06);
                                        } while (bVar35);
                                        r.z = fVar47 - b2.min.z;
                                        r.y = fVar52 - b2.min.y;
                                        r.x = fVar49 - b2.min.x;
                                        Imath_3_2::Vec3<float>::normalized(&ray.pos);
                                        fVar47 = fVar50 - b2.min.x;
                                        fVar49 = fVar51 - b2.min.y;
                                        fVar52 = ray.pos.z * (fVar48 - b2.min.z) +
                                                 ray.pos.x * fVar47 + fVar49 * ray.pos.y;
                                        r.x = fVar47 - fVar52 * ray.pos.x;
                                        r.y = fVar49 - fVar52 * ray.pos.y;
                                        r.z = (fVar48 - b2.min.z) - ray.pos.z * fVar52;
                                        fVar47 = Imath_3_2::Vec3<float>::length(&r);
                                      } while (fVar47 < fVar45);
                                      Imath_3_2::Line3<float>::set(&ray,&b2.min,&r_1);
                                      bVar35 = Imath_3_2::intersects<float>(pBVar41,&ray,&r);
                                      if (bVar35) {
                                        __assert_fail("!intersects (box, ray, ip)",
                                                                                                            
                                                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBoxAlgo.cpp"
                                                  ,0x28b,
                                                  "void (anonymous namespace)::testRayBoxIntersection(const Box3f &)"
                                                  );
                                      }
                                    }
                                  }
                                }
                                lVar38 = local_200 + 1;
                              } while( true );
                            }
                          }
                          __assert_fail("b && r == V3f (0, 0, 1e15f) && s == V3f (0, 0, -1e15f)",
                                        "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBoxAlgo.cpp"
                                        ,0x18e,"void (anonymous namespace)::entryAndExitPoints2()");
                        }
                      }
                      __assert_fail("b && r == V3f (0, 0, -1e15f) && s == V3f (0, 0, 1e15f)",
                                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBoxAlgo.cpp"
                                    ,0x189,"void (anonymous namespace)::entryAndExitPoints2()");
                    }
                  }
                  __assert_fail("b && r == V3f (0, 1e15f, 0) && s == V3f (0, -1e15f, 0)",
                                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBoxAlgo.cpp"
                                ,0x17a,"void (anonymous namespace)::entryAndExitPoints2()");
                }
              }
              __assert_fail("b && r == V3f (0, -1e15f, 0) && s == V3f (0, 1e15f, 0)",
                            "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBoxAlgo.cpp"
                            ,0x175,"void (anonymous namespace)::entryAndExitPoints2()");
            }
          }
          __assert_fail("b && r == V3f (1e15f, 0, 0) && s == V3f (-1e15f, 0, 0)",
                        "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBoxAlgo.cpp"
                        ,0x166,"void (anonymous namespace)::entryAndExitPoints2()");
        }
      }
      __assert_fail("b && r == V3f (-1e15f, 0, 0) && s == V3f (1e15f, 0, 0)",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBoxAlgo.cpp"
                    ,0x161,"void (anonymous namespace)::entryAndExitPoints2()");
    }
    lVar37 = lVar38 * 0x18;
    pBVar41 = (Box<Imath_3_2::Vec3<float>_> *)((long)M.x + lVar37);
    random._state[0] = 0xf8c9;
    random._state[1] = 0xfe47;
    random._state[2] = 0xf8c9;
    bVar35 = Imath_3_2::Box<Imath_3_2::Vec3<float>_>::isEmpty(pBVar41);
    if (bVar35) {
      poVar36 = std::operator<<((ostream *)&std::cout,"    empty box, no rays intersect");
      std::endl<char,std::char_traits<char>>(poVar36);
      iVar42 = 100000;
      while (bVar35 = iVar42 != 0, iVar42 = iVar42 + -1, bVar35) {
        dVar26 = Imath_3_2::Rand48::nextf
                           (&random,(double)*(float *)((long)M.x + lVar37 + 0xc),
                            (double)(pBVar41->min).x);
        dVar27 = Imath_3_2::Rand48::nextf
                           (&random,(double)*(float *)((long)M.x + lVar37 + 0x10),
                            (double)*(float *)((long)M.x + lVar37 + 4));
        dVar28 = Imath_3_2::Rand48::nextf
                           (&random,(double)*(float *)((long)M.x + lVar37 + 0x14),
                            (double)*(float *)((long)M.x + lVar37 + 8));
        b2.min.z = (float)dVar28;
        b2.min.y = (float)dVar27;
        b2.min.x = (float)dVar26;
        Imath_3_2::hollowSphereRand<Imath_3_2::Vec3<float>,Imath_3_2::Rand48>
                  ((Imath_3_2 *)&ray,&random);
        r_1.z = b2.min.z + ray.pos.z;
        r_1.x = ray.pos.x + b2.min.x;
        r_1.y = ray.pos.y + b2.min.y;
        Imath_3_2::Line3<float>::set(&ray,&b2.min,&r_1);
        bVar35 = Imath_3_2::findEntryAndExitPoints<float>(&ray,pBVar41,&r,&s);
        if (bVar35) {
          __assertion = "!findEntryAndExitPoints (Line3f (p1, p2), box, r, s)";
          __line = 0x3d;
LAB_0011df22:
          __assert_fail(__assertion,
                        "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBoxAlgo.cpp"
                        ,__line,"void (anonymous namespace)::testEntryAndExitPoints(const Box3f &)")
          ;
        }
      }
    }
    else {
      poVar36 = std::operator<<((ostream *)&std::cout,"    box = (");
      poVar36 = Imath_3_2::operator<<(poVar36,(Vec3<float> *)pBVar41);
      poVar36 = std::operator<<(poVar36," ");
      pVVar40 = (Vec3<float> *)((long)M.x + lVar37 + 0xc);
      poVar36 = Imath_3_2::operator<<(poVar36,pVVar40);
      poVar36 = std::operator<<(poVar36,")");
      std::endl<char,std::char_traits<char>>(poVar36);
      bVar35 = Imath_3_2::Vec3<float>::operator==(pVVar40,(Vec3<float> *)pBVar41);
      if (bVar35) {
        poVar36 = std::operator<<((ostream *)&std::cout,"    single-point box, ray intersects");
        std::endl<char,std::char_traits<char>>(poVar36);
        for (lVar39 = 8; lVar39 != 0x50; lVar39 = lVar39 + 0xc) {
          b2.min.z = *(float *)((long)M.x + lVar37 + 8) +
                     *(float *)((long)&(anonymous_namespace)::
                                       testRayBoxIntersection(Imath_3_2::Box<Imath_3_2::Vec3<float>>const&)
                                       ::off + lVar39);
          uVar5 = (pBVar41->min).x;
          uVar16 = (pBVar41->min).y;
          b2.min.y = (float)((ulong)*(undefined8 *)(&UNK_00157a38 + lVar39) >> 0x20) + (float)uVar16
          ;
          b2.min.x = (float)*(undefined8 *)(&UNK_00157a38 + lVar39) + (float)uVar5;
          Imath_3_2::Line3<float>::set(&ray,&b2.min,(Vec3<float> *)pBVar41);
          bVar35 = Imath_3_2::findEntryAndExitPoints<float>(&ray,pBVar41,&r_1,&r);
          if (!bVar35) {
            __assertion = "findEntryAndExitPoints (Line3f (p1, box.min), box, r, s)";
            __line = 0x59;
            goto LAB_0011df22;
          }
          fVar45 = (pBVar41->min).x;
          if ((r_1.x != fVar45) || (NAN(r_1.x) || NAN(fVar45))) {
LAB_0011de7f:
            __assertion = "r == box.min && s == box.min";
            __line = 0x5a;
            goto LAB_0011df22;
          }
          fVar46 = *(float *)((long)M.x + lVar37 + 4);
          if ((r_1.y != fVar46) || (NAN(r_1.y) || NAN(fVar46))) goto LAB_0011de7f;
          fVar47 = *(float *)((long)M.x + lVar37 + 8);
          if ((r_1.z != fVar47) || (NAN(r_1.z) || NAN(fVar47))) goto LAB_0011de7f;
          if ((r.x != fVar45) || (NAN(r.x) || NAN(fVar45))) goto LAB_0011de7f;
          if ((((r.y != fVar46) || (NAN(r.y) || NAN(fVar46))) || (r.z != fVar47)) ||
             (NAN(r.z) || NAN(fVar47))) goto LAB_0011de7f;
        }
        poVar36 = std::operator<<((ostream *)&std::cout,
                                  "    single-point box, ray does not intersect");
        std::endl<char,std::char_traits<char>>(poVar36);
        for (iVar42 = 0; iVar42 != 100000; iVar42 = iVar42 + 1) {
          Imath_3_2::hollowSphereRand<Imath_3_2::Vec3<float>,Imath_3_2::Rand48>
                    ((Imath_3_2 *)&ray,&random);
          b2.min.z = ray.pos.z + *(float *)((long)M.x + lVar37 + 8);
          uVar6 = (pBVar41->min).x;
          uVar17 = (pBVar41->min).y;
          b2.min.y = (float)uVar17 + ray.pos.y;
          b2.min.x = (float)uVar6 + ray.pos.x;
          do {
            do {
              Imath_3_2::hollowSphereRand<Imath_3_2::Vec3<float>,Imath_3_2::Rand48>
                        ((Imath_3_2 *)&ray,&random);
              uVar7 = (pBVar41->min).x;
              uVar18 = (pBVar41->min).y;
              fVar46 = (float)uVar7 + ray.pos.x;
              fVar47 = (float)uVar18 + ray.pos.y;
              fVar45 = ray.pos.z + *(float *)((long)M.x + lVar37 + 8);
              r_1.x = fVar46;
              r_1.y = fVar47;
              r_1.z = fVar45;
              bVar35 = anon_unknown.dwarf_463b6::approximatelyEqual(&b2.min,&r_1,5.9604645e-06);
            } while (bVar35);
            r.z = fVar45 - b2.min.z;
            r.y = fVar47 - b2.min.y;
            r.x = fVar46 - b2.min.x;
            Imath_3_2::Vec3<float>::normalized(&ray.pos);
            fVar45 = *(float *)((long)M.x + lVar37 + 8) - b2.min.z;
            uVar8 = (pBVar41->min).x;
            uVar19 = (pBVar41->min).y;
            fVar46 = (float)uVar8 - b2.min.x;
            fVar47 = (float)uVar19 - b2.min.y;
            fVar49 = ray.pos.z * fVar45 + ray.pos.x * fVar46 + fVar47 * ray.pos.y;
            r.z = fVar45 - ray.pos.z * fVar49;
            r.y = fVar47 - fVar49 * ray.pos.y;
            r.x = fVar46 - fVar49 * ray.pos.x;
            fVar45 = Imath_3_2::Vec3<float>::length(&r);
          } while (fVar45 < 1e-05);
          Imath_3_2::Line3<float>::set(&ray,&b2.min,&r_1);
          bVar35 = Imath_3_2::findEntryAndExitPoints<float>(&ray,pBVar41,&r,&s);
          if (bVar35) {
            __assertion = "!findEntryAndExitPoints (ray, box, r, s)";
            __line = 0x7c;
            goto LAB_0011df22;
          }
        }
      }
      else {
        poVar36 = std::operator<<((ostream *)&std::cout,"    ray starts outside box, intersects");
        std::endl<char,std::char_traits<char>>(poVar36);
        fVar45 = *(float *)((long)M.x + lVar37 + 0xc);
        fVar46 = (pBVar41->min).x;
        fVar47 = *(float *)((long)M.x + lVar37 + 4);
        fVar48 = fVar45 - fVar46;
        fVar49 = *(float *)((long)M.x + lVar37 + 0x10);
        fVar52 = fVar49 - fVar47;
        fVar50 = *(float *)((long)M.x + lVar37 + 0x14);
        fVar51 = *(float *)((long)M.x + lVar37 + 8);
        fVar54 = fVar50 - fVar51;
        for (iVar42 = 0; iVar42 != 100000; iVar42 = iVar42 + 1) {
          do {
            dVar26 = Imath_3_2::Rand48::nextf
                               (&random,(double)(fVar46 - fVar48),(double)(fVar48 + fVar45));
            dVar27 = Imath_3_2::Rand48::nextf
                               (&random,(double)(fVar47 - fVar52),(double)(fVar52 + fVar49));
            dVar28 = Imath_3_2::Rand48::nextf
                               (&random,(double)(fVar51 - fVar54),(double)(fVar54 + fVar50));
            b2.min.z = (float)dVar28;
            b2.min.y = (float)dVar27;
            b2.min.x = (float)dVar26;
            bVar35 = Imath_3_2::Box<Imath_3_2::Vec3<float>_>::intersects(pBVar41,&b2.min);
          } while (bVar35);
          do {
            dVar26 = Imath_3_2::Rand48::nextf
                               (&random,(double)(pBVar41->min).x,
                                (double)*(float *)((long)M.x + lVar37 + 0xc));
            dVar27 = Imath_3_2::Rand48::nextf
                               (&random,(double)*(float *)((long)M.x + lVar37 + 4),
                                (double)*(float *)((long)M.x + lVar37 + 0x10));
            dVar28 = Imath_3_2::Rand48::nextf
                               (&random,(double)*(float *)((long)M.x + lVar37 + 8),
                                (double)*(float *)((long)M.x + lVar37 + 0x14));
            r_1.z = (float)dVar28;
            r_1.x = (float)dVar26;
            r_1.y = (float)dVar27;
            bVar35 = anon_unknown.dwarf_463b6::approximatelyEqual(&b2.min,&r_1,5.9604645e-06);
          } while (bVar35);
          Imath_3_2::Line3<float>::set(&ray,&b2.min,&r_1);
          bVar35 = Imath_3_2::findEntryAndExitPoints<float>(&ray,pBVar41,&r,&s);
          if (!bVar35) {
            __assert_fail("b",
                          "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBoxAlgo.cpp"
                          ,0xaa,"void (anonymous namespace)::testEntryAndExitPoints(const Box3f &)")
            ;
          }
          fVar43 = (pBVar41->min).x;
          fVar53 = *(float *)((long)M.x + lVar37 + 0xc);
          if ((r.x != fVar43) || (NAN(r.x) || NAN(fVar43))) {
            if ((r.x != fVar53) || (NAN(r.x) || NAN(fVar53))) {
              pfVar1 = (float *)((long)M.x + lVar37 + 4);
              if ((r.y != *pfVar1) || (NAN(r.y) || NAN(*pfVar1))) {
                pfVar1 = (float *)((long)M.x + lVar37 + 0x10);
                if ((r.y != *pfVar1) || (NAN(r.y) || NAN(*pfVar1))) {
                  pfVar1 = (float *)((long)M.x + lVar37 + 8);
                  if (((r.z != *pfVar1) || (NAN(r.z) || NAN(*pfVar1))) &&
                     ((pfVar1 = (float *)((long)M.x + lVar37 + 0x14), r.z != *pfVar1 ||
                      (NAN(r.z) || NAN(*pfVar1))))) {
                    __assert_fail("r.x == box.min.x || r.x == box.max.x || r.y == box.min.y || r.y == box.max.y || r.z == box.min.z || r.z == box.max.z"
                                  ,
                                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBoxAlgo.cpp"
                                  ,0xae,
                                  "void (anonymous namespace)::testEntryAndExitPoints(const Box3f &)"
                                 );
                  }
                }
              }
            }
          }
          if ((s.x != fVar43) || (NAN(s.x) || NAN(fVar43))) {
            if ((s.x != fVar53) || (NAN(s.x) || NAN(fVar53))) {
              pfVar1 = (float *)((long)M.x + lVar37 + 4);
              if ((s.y != *pfVar1) || (NAN(s.y) || NAN(*pfVar1))) {
                pfVar1 = (float *)((long)M.x + lVar37 + 0x10);
                if ((s.y != *pfVar1) || (NAN(s.y) || NAN(*pfVar1))) {
                  pfVar1 = (float *)((long)M.x + lVar37 + 8);
                  if (((s.z != *pfVar1) || (NAN(s.z) || NAN(*pfVar1))) &&
                     ((pfVar1 = (float *)((long)M.x + lVar37 + 0x14), s.z != *pfVar1 ||
                      (NAN(s.z) || NAN(*pfVar1))))) {
                    __assert_fail("s.x == box.min.x || s.x == box.max.x || s.y == box.min.y || s.y == box.max.y || s.z == box.min.z || s.z == box.max.z"
                                  ,
                                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBoxAlgo.cpp"
                                  ,0xb2,
                                  "void (anonymous namespace)::testEntryAndExitPoints(const Box3f &)"
                                 );
                  }
                }
              }
            }
          }
          if (((r.x == fVar43) && (!NAN(r.x) && !NAN(fVar43))) && (ray.dir.x < 0.0)) {
            __assert_fail("ray.dir.x >= 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBoxAlgo.cpp"
                          ,0xb9,"void (anonymous namespace)::testEntryAndExitPoints(const Box3f &)")
            ;
          }
          if (((r.x == fVar53) && (!NAN(r.x) && !NAN(fVar53))) && (0.0 < ray.dir.x)) {
            __assert_fail("ray.dir.x <= 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBoxAlgo.cpp"
                          ,0xbb,"void (anonymous namespace)::testEntryAndExitPoints(const Box3f &)")
            ;
          }
          fVar44 = *(float *)((long)M.x + lVar37 + 4);
          if (((r.y == fVar44) && (!NAN(r.y) && !NAN(fVar44))) && (ray.dir.y < 0.0)) {
            __assert_fail("ray.dir.y >= 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBoxAlgo.cpp"
                          ,0xbd,"void (anonymous namespace)::testEntryAndExitPoints(const Box3f &)")
            ;
          }
          fVar2 = *(float *)((long)M.x + lVar37 + 0x10);
          if (((r.y == fVar2) && (!NAN(r.y) && !NAN(fVar2))) && (0.0 < ray.dir.y)) {
            __assert_fail("ray.dir.y <= 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBoxAlgo.cpp"
                          ,0xbf,"void (anonymous namespace)::testEntryAndExitPoints(const Box3f &)")
            ;
          }
          fVar3 = *(float *)((long)M.x + lVar37 + 8);
          if (((r.z == fVar3) && (!NAN(r.z) && !NAN(fVar3))) && (ray.dir.z < 0.0)) {
            __assert_fail("ray.dir.z >= 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBoxAlgo.cpp"
                          ,0xc1,"void (anonymous namespace)::testEntryAndExitPoints(const Box3f &)")
            ;
          }
          fVar4 = *(float *)((long)M.x + lVar37 + 0x14);
          if (((r.z == fVar4) && (!NAN(r.z) && !NAN(fVar4))) && (0.0 < ray.dir.z)) {
            __assert_fail("ray.dir.z <= 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBoxAlgo.cpp"
                          ,0xc3,"void (anonymous namespace)::testEntryAndExitPoints(const Box3f &)")
            ;
          }
          if (((s.x == fVar53) && (!NAN(s.x) && !NAN(fVar53))) && (ray.dir.x < 0.0)) {
            __assert_fail("ray.dir.x >= 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBoxAlgo.cpp"
                          ,0xc5,"void (anonymous namespace)::testEntryAndExitPoints(const Box3f &)")
            ;
          }
          if (((s.x == fVar43) && (!NAN(s.x) && !NAN(fVar43))) && (0.0 < ray.dir.x)) {
            __assert_fail("ray.dir.x <= 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBoxAlgo.cpp"
                          ,199,"void (anonymous namespace)::testEntryAndExitPoints(const Box3f &)");
          }
          if (((s.y == fVar2) && (!NAN(s.y) && !NAN(fVar2))) && (ray.dir.y < 0.0)) {
            __assert_fail("ray.dir.y >= 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBoxAlgo.cpp"
                          ,0xc9,"void (anonymous namespace)::testEntryAndExitPoints(const Box3f &)")
            ;
          }
          if (((s.y == fVar44) && (!NAN(s.y) && !NAN(fVar44))) && (0.0 < ray.dir.y)) {
            __assert_fail("ray.dir.y <= 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBoxAlgo.cpp"
                          ,0xcb,"void (anonymous namespace)::testEntryAndExitPoints(const Box3f &)")
            ;
          }
          if (((s.z == fVar4) && (!NAN(s.z) && !NAN(fVar4))) && (ray.dir.z < 0.0)) {
            __assert_fail("ray.dir.z >= 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBoxAlgo.cpp"
                          ,0xcd,"void (anonymous namespace)::testEntryAndExitPoints(const Box3f &)")
            ;
          }
          if (((s.z == fVar3) && (!NAN(s.z) && !NAN(fVar3))) && (0.0 < ray.dir.z)) {
            __assert_fail("ray.dir.z <= 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBoxAlgo.cpp"
                          ,0xcf,"void (anonymous namespace)::testEntryAndExitPoints(const Box3f &)")
            ;
          }
          fVar53 = (r.z - b2.min.z) * ray.dir.z +
                   (r.x - b2.min.x) * ray.dir.x + (r.y - b2.min.y) * ray.dir.y;
          ip2.x = fVar53 * ray.dir.x + b2.min.x;
          ip2.y = fVar53 * ray.dir.y + b2.min.y;
          fVar43 = 0.0;
          for (lVar39 = 0; lVar39 != 3; lVar39 = lVar39 + 1) {
            fVar44 = ABS((&b2.min.x)[lVar39]);
            if (fVar43 <= fVar44) {
              fVar43 = fVar44;
            }
            if (fVar43 <= ABS((&r.x)[lVar39])) {
              fVar43 = ABS((&r.x)[lVar39]);
            }
          }
          ip2.z = ray.dir.z * fVar53 + b2.min.z;
          bVar35 = Imath_3_2::Vec3<float>::equalWithAbsError(&ip2,&r,fVar43 * 30.0 * 1.1920929e-07);
          if (!bVar35) {
            __assert_fail("p3.equalWithAbsError (r, err)",
                          "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBoxAlgo.cpp"
                          ,0xe2,"void (anonymous namespace)::testEntryAndExitPoints(const Box3f &)")
            ;
          }
          fVar43 = (s.z - b2.min.z) * ray.dir.z +
                   (s.x - b2.min.x) * ray.dir.x + ray.dir.y * (s.y - b2.min.y);
          ip2.y = fVar43 * ray.dir.y + b2.min.y;
          ip2.x = fVar43 * ray.dir.x + b2.min.x;
          stack0xfffffffffffffd60 = CONCAT44(fStack_29c,ray.dir.z * fVar43 + b2.min.z);
          fVar43 = 0.0;
          for (lVar39 = 0; lVar39 != 3; lVar39 = lVar39 + 1) {
            fVar53 = ABS((&b2.min.x)[lVar39]);
            if (fVar43 <= fVar53) {
              fVar43 = fVar53;
            }
            if (fVar43 <= ABS((&s.x)[lVar39])) {
              fVar43 = ABS((&s.x)[lVar39]);
            }
          }
          bVar35 = Imath_3_2::Vec3<float>::equalWithAbsError(&ip2,&s,fVar43 * 30.0 * 1.1920929e-07);
          if (!bVar35) {
            __assert_fail("p3.equalWithAbsError (s, err)",
                          "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBoxAlgo.cpp"
                          ,0xf0,"void (anonymous namespace)::testEntryAndExitPoints(const Box3f &)")
            ;
          }
        }
        poVar36 = std::operator<<((ostream *)&std::cout,
                                  "    ray starts outside box, does not intersect");
        std::endl<char,std::char_traits<char>>(poVar36);
        uVar9 = (pBVar41->min).x;
        uVar20 = (pBVar41->min).y;
        uVar15 = *(undefined8 *)((long)M.x + lVar37 + 0xc);
        fVar47 = (float)uVar15;
        fVar49 = (float)((ulong)uVar15 >> 0x20);
        fVar45 = *(float *)((long)M.x + lVar37 + 8);
        fVar46 = *(float *)((long)M.x + lVar37 + 0x14);
        fVar50 = ((float)uVar9 + fVar47) * 0.5;
        fVar51 = ((float)uVar20 + fVar49) * 0.5;
        fVar48 = (fVar45 + fVar46) * 0.5;
        ray.pos.z = fVar46 - fVar45;
        ray.pos.y = fVar49 - (float)uVar20;
        ray.pos.x = fVar47 - (float)uVar9;
        fVar45 = Imath_3_2::Vec3<float>::length(&ray.pos);
        fVar45 = fVar45 * 0.51;
        fVar46 = fVar45 + fVar45;
        for (iVar42 = 0; iVar42 != 100000; iVar42 = iVar42 + 1) {
          Imath_3_2::hollowSphereRand<Imath_3_2::Vec3<float>,Imath_3_2::Rand48>
                    ((Imath_3_2 *)&ray,&random);
          b2.min.z = ray.pos.z * fVar46 + fVar48;
          b2.min.y = ray.pos.y * fVar46 + fVar51;
          b2.min.x = ray.pos.x * fVar46 + fVar50;
          do {
            do {
              Imath_3_2::hollowSphereRand<Imath_3_2::Vec3<float>,Imath_3_2::Rand48>
                        ((Imath_3_2 *)&ray,&random);
              fVar49 = ray.pos.x * fVar46 + fVar50;
              fVar52 = ray.pos.y * fVar46 + fVar51;
              fVar47 = ray.pos.z * fVar46 + fVar48;
              r_1.x = fVar49;
              r_1.y = fVar52;
              r_1.z = fVar47;
              bVar35 = anon_unknown.dwarf_463b6::approximatelyEqual(&b2.min,&r_1,5.9604645e-06);
            } while (bVar35);
            r.z = fVar47 - b2.min.z;
            r.y = fVar52 - b2.min.y;
            r.x = fVar49 - b2.min.x;
            Imath_3_2::Vec3<float>::normalized(&ray.pos);
            fVar47 = fVar50 - b2.min.x;
            fVar49 = fVar51 - b2.min.y;
            fVar52 = ray.pos.z * (fVar48 - b2.min.z) + ray.pos.x * fVar47 + fVar49 * ray.pos.y;
            r.x = fVar47 - fVar52 * ray.pos.x;
            r.y = fVar49 - fVar52 * ray.pos.y;
            r.z = (fVar48 - b2.min.z) - ray.pos.z * fVar52;
            fVar47 = Imath_3_2::Vec3<float>::length(&r);
          } while (fVar47 < fVar45);
          Imath_3_2::Line3<float>::set(&ray,&b2.min,&r_1);
          bVar35 = Imath_3_2::findEntryAndExitPoints<float>(&ray,pBVar41,&r,&s);
          if (bVar35) {
            __assert_fail("!findEntryAndExitPoints (ray, box, r, s)",
                          "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBoxAlgo.cpp"
                          ,0x117,"void (anonymous namespace)::testEntryAndExitPoints(const Box3f &)"
                         );
          }
        }
      }
    }
    lVar38 = lVar38 + 1;
  } while( true );
}

Assistant:

void
testBoxAlgo ()
{
    cout << "Testing box algorithms" << endl;

    entryAndExitPoints1 ();
    entryAndExitPoints2 ();
    rayBoxIntersection1 ();
    rayBoxIntersection2 ();
    boxMatrixTransform ();
    pointInAndOnBox ();

    cout << "ok\n" << endl;
}